

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  uint uVar11;
  int iVar12;
  undefined4 uVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined8 uVar29;
  ulong uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  long lVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  undefined1 auVar87 [32];
  byte bVar88;
  ulong uVar89;
  long lVar90;
  uint uVar91;
  uint uVar92;
  long lVar93;
  ulong uVar94;
  long lVar95;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  Geometry *pGVar96;
  uint uVar97;
  byte bVar98;
  ulong uVar99;
  float fVar100;
  float fVar101;
  float fVar148;
  float fVar150;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar105 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar107 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar154;
  undefined4 uVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar180;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar200;
  float fVar201;
  float fVar203;
  undefined1 auVar196 [32];
  float fVar202;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [64];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar227 [32];
  undefined1 auVar231 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  RTCFilterFunctionNArguments local_858;
  undefined1 (*local_828) [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [64];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined4 uStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined4 local_5e0;
  int local_5dc;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  float local_580 [4];
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar228 [32];
  
  PVar10 = prim[1];
  uVar99 = (ulong)(byte)PVar10;
  fVar180 = *(float *)(prim + uVar99 * 0x19 + 0x12);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar102 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar177 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar181 = vsubps_avx(auVar102,*(undefined1 (*) [16])(prim + uVar99 * 0x19 + 6));
  fVar191 = fVar180 * auVar181._0_4_;
  fVar154 = fVar180 * auVar177._0_4_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar99 * 4 + 6);
  auVar114 = vpmovsxbd_avx2(auVar102);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar99 * 5 + 6);
  auVar112 = vpmovsxbd_avx2(auVar106);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar99 * 6 + 6);
  auVar123 = vpmovsxbd_avx2(auVar104);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar99 * 0xb + 6);
  auVar122 = vpmovsxbd_avx2(auVar103);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6);
  auVar118 = vpmovsxbd_avx2(auVar5);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar115 = vcvtdq2ps_avx(auVar118);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar10 * 0xc + uVar99 + 6);
  auVar113 = vpmovsxbd_avx2(auVar6);
  auVar113 = vcvtdq2ps_avx(auVar113);
  uVar94 = (ulong)(uint)((int)(uVar99 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar94 + 6);
  auVar121 = vpmovsxbd_avx2(auVar7);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar94 + uVar99 + 6);
  auVar116 = vpmovsxbd_avx2(auVar8);
  auVar116 = vcvtdq2ps_avx(auVar116);
  uVar89 = (ulong)(uint)((int)(uVar99 * 5) << 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar110 = vpmovsxbd_avx2(auVar9);
  auVar117 = vcvtdq2ps_avx(auVar110);
  auVar223._4_4_ = fVar154;
  auVar223._0_4_ = fVar154;
  auVar223._8_4_ = fVar154;
  auVar223._12_4_ = fVar154;
  auVar223._16_4_ = fVar154;
  auVar223._20_4_ = fVar154;
  auVar223._24_4_ = fVar154;
  auVar223._28_4_ = fVar154;
  auVar227._8_4_ = 1;
  auVar227._0_8_ = 0x100000001;
  auVar227._12_4_ = 1;
  auVar227._16_4_ = 1;
  auVar227._20_4_ = 1;
  auVar227._24_4_ = 1;
  auVar227._28_4_ = 1;
  auVar108 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar232 = ZEXT3264(auVar108);
  auVar120 = ZEXT1632(CONCAT412(fVar180 * auVar177._12_4_,
                                CONCAT48(fVar180 * auVar177._8_4_,
                                         CONCAT44(fVar180 * auVar177._4_4_,fVar154))));
  auVar119 = vpermps_avx2(auVar227,auVar120);
  auVar109 = vpermps_avx512vl(auVar108,auVar120);
  fVar154 = auVar109._0_4_;
  fVar171 = auVar109._4_4_;
  auVar120._4_4_ = fVar171 * auVar123._4_4_;
  auVar120._0_4_ = fVar154 * auVar123._0_4_;
  fVar172 = auVar109._8_4_;
  auVar120._8_4_ = fVar172 * auVar123._8_4_;
  fVar173 = auVar109._12_4_;
  auVar120._12_4_ = fVar173 * auVar123._12_4_;
  fVar174 = auVar109._16_4_;
  auVar120._16_4_ = fVar174 * auVar123._16_4_;
  fVar175 = auVar109._20_4_;
  auVar120._20_4_ = fVar175 * auVar123._20_4_;
  fVar176 = auVar109._24_4_;
  auVar120._24_4_ = fVar176 * auVar123._24_4_;
  auVar120._28_4_ = auVar118._28_4_;
  auVar118._4_4_ = auVar113._4_4_ * fVar171;
  auVar118._0_4_ = auVar113._0_4_ * fVar154;
  auVar118._8_4_ = auVar113._8_4_ * fVar172;
  auVar118._12_4_ = auVar113._12_4_ * fVar173;
  auVar118._16_4_ = auVar113._16_4_ * fVar174;
  auVar118._20_4_ = auVar113._20_4_ * fVar175;
  auVar118._24_4_ = auVar113._24_4_ * fVar176;
  auVar118._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = auVar117._4_4_ * fVar171;
  auVar110._0_4_ = auVar117._0_4_ * fVar154;
  auVar110._8_4_ = auVar117._8_4_ * fVar172;
  auVar110._12_4_ = auVar117._12_4_ * fVar173;
  auVar110._16_4_ = auVar117._16_4_ * fVar174;
  auVar110._20_4_ = auVar117._20_4_ * fVar175;
  auVar110._24_4_ = auVar117._24_4_ * fVar176;
  auVar110._28_4_ = auVar109._28_4_;
  auVar102 = vfmadd231ps_fma(auVar120,auVar119,auVar112);
  auVar106 = vfmadd231ps_fma(auVar118,auVar119,auVar115);
  auVar104 = vfmadd231ps_fma(auVar110,auVar116,auVar119);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar223,auVar114);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar223,auVar122);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar121,auVar223);
  auVar224._4_4_ = fVar191;
  auVar224._0_4_ = fVar191;
  auVar224._8_4_ = fVar191;
  auVar224._12_4_ = fVar191;
  auVar224._16_4_ = fVar191;
  auVar224._20_4_ = fVar191;
  auVar224._24_4_ = fVar191;
  auVar224._28_4_ = fVar191;
  auVar110 = ZEXT1632(CONCAT412(fVar180 * auVar181._12_4_,
                                CONCAT48(fVar180 * auVar181._8_4_,
                                         CONCAT44(fVar180 * auVar181._4_4_,fVar191))));
  auVar118 = vpermps_avx2(auVar227,auVar110);
  auVar110 = vpermps_avx512vl(auVar108,auVar110);
  fVar180 = auVar110._0_4_;
  fVar154 = auVar110._4_4_;
  auVar119._4_4_ = fVar154 * auVar123._4_4_;
  auVar119._0_4_ = fVar180 * auVar123._0_4_;
  fVar171 = auVar110._8_4_;
  auVar119._8_4_ = fVar171 * auVar123._8_4_;
  fVar172 = auVar110._12_4_;
  auVar119._12_4_ = fVar172 * auVar123._12_4_;
  fVar173 = auVar110._16_4_;
  auVar119._16_4_ = fVar173 * auVar123._16_4_;
  fVar174 = auVar110._20_4_;
  auVar119._20_4_ = fVar174 * auVar123._20_4_;
  fVar175 = auVar110._24_4_;
  auVar119._24_4_ = fVar175 * auVar123._24_4_;
  auVar119._28_4_ = 1;
  auVar108._4_4_ = auVar113._4_4_ * fVar154;
  auVar108._0_4_ = auVar113._0_4_ * fVar180;
  auVar108._8_4_ = auVar113._8_4_ * fVar171;
  auVar108._12_4_ = auVar113._12_4_ * fVar172;
  auVar108._16_4_ = auVar113._16_4_ * fVar173;
  auVar108._20_4_ = auVar113._20_4_ * fVar174;
  auVar108._24_4_ = auVar113._24_4_ * fVar175;
  auVar108._28_4_ = auVar123._28_4_;
  auVar113._4_4_ = auVar117._4_4_ * fVar154;
  auVar113._0_4_ = auVar117._0_4_ * fVar180;
  auVar113._8_4_ = auVar117._8_4_ * fVar171;
  auVar113._12_4_ = auVar117._12_4_ * fVar172;
  auVar113._16_4_ = auVar117._16_4_ * fVar173;
  auVar113._20_4_ = auVar117._20_4_ * fVar174;
  auVar113._24_4_ = auVar117._24_4_ * fVar175;
  auVar113._28_4_ = auVar110._28_4_;
  auVar103 = vfmadd231ps_fma(auVar119,auVar118,auVar112);
  auVar5 = vfmadd231ps_fma(auVar108,auVar118,auVar115);
  auVar6 = vfmadd231ps_fma(auVar113,auVar118,auVar116);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar224,auVar114);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar224,auVar122);
  auVar216._8_4_ = 0x7fffffff;
  auVar216._0_8_ = 0x7fffffff7fffffff;
  auVar216._12_4_ = 0x7fffffff;
  auVar216._16_4_ = 0x7fffffff;
  auVar216._20_4_ = 0x7fffffff;
  auVar216._24_4_ = 0x7fffffff;
  auVar216._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar224,auVar121);
  auVar114 = vandps_avx(ZEXT1632(auVar102),auVar216);
  auVar214._8_4_ = 0x219392ef;
  auVar214._0_8_ = 0x219392ef219392ef;
  auVar214._12_4_ = 0x219392ef;
  auVar214._16_4_ = 0x219392ef;
  auVar214._20_4_ = 0x219392ef;
  auVar214._24_4_ = 0x219392ef;
  auVar214._28_4_ = 0x219392ef;
  uVar94 = vcmpps_avx512vl(auVar114,auVar214,1);
  bVar15 = (bool)((byte)uVar94 & 1);
  auVar109._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar102._0_4_;
  bVar15 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar102._4_4_;
  bVar15 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar102._8_4_;
  bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar102._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar114 = vandps_avx(ZEXT1632(auVar106),auVar216);
  uVar94 = vcmpps_avx512vl(auVar114,auVar214,1);
  bVar15 = (bool)((byte)uVar94 & 1);
  auVar111._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar106._0_4_;
  bVar15 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar106._4_4_;
  bVar15 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar106._8_4_;
  bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar106._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar114 = vandps_avx(ZEXT1632(auVar104),auVar216);
  uVar94 = vcmpps_avx512vl(auVar114,auVar214,1);
  bVar15 = (bool)((byte)uVar94 & 1);
  auVar114._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar104._0_4_;
  bVar15 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar104._4_4_;
  bVar15 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar104._8_4_;
  bVar15 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar104._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar112 = vrcp14ps_avx512vl(auVar109);
  auVar215._8_4_ = 0x3f800000;
  auVar215._0_8_ = 0x3f8000003f800000;
  auVar215._12_4_ = 0x3f800000;
  auVar215._16_4_ = 0x3f800000;
  auVar215._20_4_ = 0x3f800000;
  auVar215._24_4_ = 0x3f800000;
  auVar215._28_4_ = 0x3f800000;
  auVar102 = vfnmadd213ps_fma(auVar109,auVar112,auVar215);
  auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar112,auVar112);
  auVar112 = vrcp14ps_avx512vl(auVar111);
  auVar106 = vfnmadd213ps_fma(auVar111,auVar112,auVar215);
  auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar112,auVar112);
  auVar112 = vrcp14ps_avx512vl(auVar114);
  auVar104 = vfnmadd213ps_fma(auVar114,auVar112,auVar215);
  auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar112,auVar112);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 7 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar103));
  auVar121._4_4_ = auVar102._4_4_ * auVar114._4_4_;
  auVar121._0_4_ = auVar102._0_4_ * auVar114._0_4_;
  auVar121._8_4_ = auVar102._8_4_ * auVar114._8_4_;
  auVar121._12_4_ = auVar102._12_4_ * auVar114._12_4_;
  auVar121._16_4_ = auVar114._16_4_ * 0.0;
  auVar121._20_4_ = auVar114._20_4_ * 0.0;
  auVar121._24_4_ = auVar114._24_4_ * 0.0;
  auVar121._28_4_ = auVar114._28_4_;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 9 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar103));
  auVar113 = vpbroadcastd_avx512vl();
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar10 * 0x10 + 6));
  auVar188._0_4_ = auVar102._0_4_ * auVar114._0_4_;
  auVar188._4_4_ = auVar102._4_4_ * auVar114._4_4_;
  auVar188._8_4_ = auVar102._8_4_ * auVar114._8_4_;
  auVar188._12_4_ = auVar102._12_4_ * auVar114._12_4_;
  auVar188._16_4_ = auVar114._16_4_ * 0.0;
  auVar188._20_4_ = auVar114._20_4_ * 0.0;
  auVar188._24_4_ = auVar114._24_4_ * 0.0;
  auVar188._28_4_ = 0;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar10 * 0x10 + uVar99 * -2 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar5));
  auVar116._4_4_ = auVar106._4_4_ * auVar114._4_4_;
  auVar116._0_4_ = auVar106._0_4_ * auVar114._0_4_;
  auVar116._8_4_ = auVar106._8_4_ * auVar114._8_4_;
  auVar116._12_4_ = auVar106._12_4_ * auVar114._12_4_;
  auVar116._16_4_ = auVar114._16_4_ * 0.0;
  auVar116._20_4_ = auVar114._20_4_ * 0.0;
  auVar116._24_4_ = auVar114._24_4_ * 0.0;
  auVar116._28_4_ = auVar114._28_4_;
  auVar114 = vcvtdq2ps_avx(auVar112);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar5));
  auVar178._0_4_ = auVar106._0_4_ * auVar114._0_4_;
  auVar178._4_4_ = auVar106._4_4_ * auVar114._4_4_;
  auVar178._8_4_ = auVar106._8_4_ * auVar114._8_4_;
  auVar178._12_4_ = auVar106._12_4_ * auVar114._12_4_;
  auVar178._16_4_ = auVar114._16_4_ * 0.0;
  auVar178._20_4_ = auVar114._20_4_ * 0.0;
  auVar178._24_4_ = auVar114._24_4_ * 0.0;
  auVar178._28_4_ = 0;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 + uVar99 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar6));
  auVar117._4_4_ = auVar114._4_4_ * auVar104._4_4_;
  auVar117._0_4_ = auVar114._0_4_ * auVar104._0_4_;
  auVar117._8_4_ = auVar114._8_4_ * auVar104._8_4_;
  auVar117._12_4_ = auVar114._12_4_ * auVar104._12_4_;
  auVar117._16_4_ = auVar114._16_4_ * 0.0;
  auVar117._20_4_ = auVar114._20_4_ * 0.0;
  auVar117._24_4_ = auVar114._24_4_ * 0.0;
  auVar117._28_4_ = auVar114._28_4_;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x17 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar6));
  auVar160._0_4_ = auVar104._0_4_ * auVar114._0_4_;
  auVar160._4_4_ = auVar104._4_4_ * auVar114._4_4_;
  auVar160._8_4_ = auVar104._8_4_ * auVar114._8_4_;
  auVar160._12_4_ = auVar104._12_4_ * auVar114._12_4_;
  auVar160._16_4_ = auVar114._16_4_ * 0.0;
  auVar160._20_4_ = auVar114._20_4_ * 0.0;
  auVar160._24_4_ = auVar114._24_4_ * 0.0;
  auVar160._28_4_ = 0;
  auVar114 = vpminsd_avx2(auVar121,auVar188);
  auVar112 = vpminsd_avx2(auVar116,auVar178);
  auVar114 = vmaxps_avx(auVar114,auVar112);
  auVar112 = vpminsd_avx2(auVar117,auVar160);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar123._4_4_ = uVar155;
  auVar123._0_4_ = uVar155;
  auVar123._8_4_ = uVar155;
  auVar123._12_4_ = uVar155;
  auVar123._16_4_ = uVar155;
  auVar123._20_4_ = uVar155;
  auVar123._24_4_ = uVar155;
  auVar123._28_4_ = uVar155;
  auVar112 = vmaxps_avx512vl(auVar112,auVar123);
  auVar114 = vmaxps_avx(auVar114,auVar112);
  auVar112._8_4_ = 0x3f7ffffa;
  auVar112._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar112._12_4_ = 0x3f7ffffa;
  auVar112._16_4_ = 0x3f7ffffa;
  auVar112._20_4_ = 0x3f7ffffa;
  auVar112._24_4_ = 0x3f7ffffa;
  auVar112._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar114,auVar112);
  auVar114 = vpmaxsd_avx2(auVar121,auVar188);
  auVar112 = vpmaxsd_avx2(auVar116,auVar178);
  auVar114 = vminps_avx(auVar114,auVar112);
  auVar112 = vpmaxsd_avx2(auVar117,auVar160);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar122._4_4_ = uVar155;
  auVar122._0_4_ = uVar155;
  auVar122._8_4_ = uVar155;
  auVar122._12_4_ = uVar155;
  auVar122._16_4_ = uVar155;
  auVar122._20_4_ = uVar155;
  auVar122._24_4_ = uVar155;
  auVar122._28_4_ = uVar155;
  auVar112 = vminps_avx512vl(auVar112,auVar122);
  auVar114 = vminps_avx(auVar114,auVar112);
  auVar115._8_4_ = 0x3f800003;
  auVar115._0_8_ = 0x3f8000033f800003;
  auVar115._12_4_ = 0x3f800003;
  auVar115._16_4_ = 0x3f800003;
  auVar115._20_4_ = 0x3f800003;
  auVar115._24_4_ = 0x3f800003;
  auVar115._28_4_ = 0x3f800003;
  auVar114 = vmulps_avx512vl(auVar114,auVar115);
  uVar31 = vpcmpgtd_avx512vl(auVar113,_DAT_01fe9900);
  uVar29 = vcmpps_avx512vl(local_320,auVar114,2);
  if ((byte)((byte)uVar29 & (byte)uVar31) != 0) {
    uVar94 = (ulong)(byte)((byte)uVar29 & (byte)uVar31);
    local_828 = (undefined1 (*) [32])local_100;
    auVar170 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar170);
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar170 = ZEXT1664(auVar102);
    do {
      lVar95 = 0;
      for (uVar89 = uVar94; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        lVar95 = lVar95 + 1;
      }
      uVar97 = *(uint *)(prim + 2);
      uVar11 = *(uint *)(prim + lVar95 * 4 + 6);
      pGVar96 = (context->scene->geometries).items[uVar97].ptr;
      uVar89 = (ulong)*(uint *)(*(long *)&pGVar96->field_0x58 +
                               (ulong)uVar11 *
                               pGVar96[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar90 = (long)pGVar96[1].intersectionFilterN * uVar89;
      lVar95 = *(long *)&pGVar96[1].time_range.upper;
      auVar102 = *(undefined1 (*) [16])(lVar95 + lVar90);
      lVar93 = (long)pGVar96[1].intersectionFilterN * (uVar89 + 1);
      auVar106 = *(undefined1 (*) [16])(lVar95 + lVar93);
      iVar12 = (int)pGVar96[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar73 = (long)iVar12 * 0x44;
      auVar181._8_4_ = 0xbeaaaaab;
      auVar181._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar181._12_4_ = 0xbeaaaaab;
      auVar32 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  (pGVar96[2].intersectionFilterN +
                                  uVar89 * (long)pGVar96[2].pointQueryFunc),auVar102,auVar181);
      auVar6 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                (pGVar96[2].intersectionFilterN +
                                (long)pGVar96[2].pointQueryFunc * (uVar89 + 1)),auVar106,auVar181);
      auVar5 = vsubps_avx(auVar102,auVar104);
      uVar155 = auVar5._0_4_;
      auVar182._4_4_ = uVar155;
      auVar182._0_4_ = uVar155;
      auVar182._8_4_ = uVar155;
      auVar182._12_4_ = uVar155;
      auVar103 = vshufps_avx(auVar5,auVar5,0x55);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar180 = pre->ray_space[k].vz.field_0.m128[0];
      fVar154 = pre->ray_space[k].vz.field_0.m128[1];
      fVar171 = pre->ray_space[k].vz.field_0.m128[2];
      fVar172 = pre->ray_space[k].vz.field_0.m128[3];
      auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
      auVar221._0_4_ = fVar180 * auVar5._0_4_;
      auVar221._4_4_ = fVar154 * auVar5._4_4_;
      auVar221._8_4_ = fVar171 * auVar5._8_4_;
      auVar221._12_4_ = fVar172 * auVar5._12_4_;
      auVar103 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar4,auVar103);
      auVar7 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar3,auVar182);
      auVar5 = vsubps_avx(auVar32,auVar104);
      uVar155 = auVar5._0_4_;
      auVar183._4_4_ = uVar155;
      auVar183._0_4_ = uVar155;
      auVar183._8_4_ = uVar155;
      auVar183._12_4_ = uVar155;
      auVar103 = vshufps_avx(auVar5,auVar5,0x55);
      auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
      auVar107._0_4_ = fVar180 * auVar5._0_4_;
      auVar107._4_4_ = fVar154 * auVar5._4_4_;
      auVar107._8_4_ = fVar171 * auVar5._8_4_;
      auVar107._12_4_ = fVar172 * auVar5._12_4_;
      auVar103 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar4,auVar103);
      auVar8 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar3,auVar183);
      auVar5 = vsubps_avx(auVar6,auVar104);
      uVar155 = auVar5._0_4_;
      auVar105._4_4_ = uVar155;
      auVar105._0_4_ = uVar155;
      auVar105._8_4_ = uVar155;
      auVar105._12_4_ = uVar155;
      auVar103 = vshufps_avx(auVar5,auVar5,0x55);
      auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
      auVar222._0_4_ = fVar180 * auVar5._0_4_;
      auVar222._4_4_ = fVar154 * auVar5._4_4_;
      auVar222._8_4_ = fVar171 * auVar5._8_4_;
      auVar222._12_4_ = fVar172 * auVar5._12_4_;
      auVar103 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar4,auVar103);
      auVar5 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar3,auVar105);
      auVar103 = vsubps_avx(auVar106,auVar104);
      uVar155 = auVar103._0_4_;
      auVar177._4_4_ = uVar155;
      auVar177._0_4_ = uVar155;
      auVar177._8_4_ = uVar155;
      auVar177._12_4_ = uVar155;
      auVar104 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
      auVar226._0_4_ = fVar180 * auVar103._0_4_;
      auVar226._4_4_ = fVar154 * auVar103._4_4_;
      auVar226._8_4_ = fVar171 * auVar103._8_4_;
      auVar226._12_4_ = fVar172 * auVar103._12_4_;
      auVar104 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar4,auVar104);
      auVar9 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar3,auVar177);
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar73);
      uVar155 = auVar7._0_4_;
      local_660._4_4_ = uVar155;
      local_660._0_4_ = uVar155;
      local_660._8_4_ = uVar155;
      local_660._12_4_ = uVar155;
      local_660._16_4_ = uVar155;
      local_660._20_4_ = uVar155;
      local_660._24_4_ = uVar155;
      local_660._28_4_ = uVar155;
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x484);
      auVar161._8_4_ = 1;
      auVar161._0_8_ = 0x100000001;
      auVar161._12_4_ = 1;
      auVar161._16_4_ = 1;
      auVar161._20_4_ = 1;
      auVar161._24_4_ = 1;
      auVar161._28_4_ = 1;
      local_680 = vpermps_avx2(auVar161,ZEXT1632(auVar7));
      local_6a0 = vbroadcastss_avx512vl(auVar8);
      local_6c0 = vpermps_avx512vl(auVar161,ZEXT1632(auVar8));
      auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x908);
      local_6e0 = vbroadcastss_avx512vl(auVar5);
      local_700 = vpermps_avx512vl(auVar161,ZEXT1632(auVar5));
      auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0xd8c);
      uVar155 = auVar9._0_4_;
      local_720._4_4_ = uVar155;
      local_720._0_4_ = uVar155;
      fStack_718 = (float)uVar155;
      fStack_714 = (float)uVar155;
      fStack_710 = (float)uVar155;
      fStack_70c = (float)uVar155;
      fStack_708 = (float)uVar155;
      register0x0000139c = uVar155;
      _local_740 = vpermps_avx512vl(auVar161,ZEXT1632(auVar9));
      auVar115 = vmulps_avx512vl(_local_720,auVar122);
      auVar113 = vmulps_avx512vl(_local_740,auVar122);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar123,local_6e0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar123,local_700);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,local_6a0);
      auVar116 = vfmadd231ps_avx512vl(auVar113,auVar112,local_6c0);
      auVar177 = vfmadd231ps_fma(auVar115,auVar114,local_660);
      auVar213 = ZEXT1664(auVar177);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar73);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x484);
      auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x908);
      auVar181 = vfmadd231ps_fma(auVar116,auVar114,local_680);
      auVar208 = ZEXT1664(auVar181);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0xd8c);
      auVar117 = vmulps_avx512vl(_local_720,auVar116);
      auVar118 = vmulps_avx512vl(_local_740,auVar116);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar121,local_6e0);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar121,local_700);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,local_6a0);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar113,local_6c0);
      auVar182 = vfmadd231ps_fma(auVar117,auVar115,local_660);
      auVar217 = ZEXT1664(auVar182);
      auVar183 = vfmadd231ps_fma(auVar118,auVar115,local_680);
      auVar117 = vsubps_avx512vl(ZEXT1632(auVar182),ZEXT1632(auVar177));
      auVar118 = vsubps_avx512vl(ZEXT1632(auVar183),ZEXT1632(auVar181));
      auVar110 = vmulps_avx512vl(ZEXT1632(auVar181),auVar117);
      auVar119 = vmulps_avx512vl(ZEXT1632(auVar177),auVar118);
      auVar110 = vsubps_avx512vl(auVar110,auVar119);
      auVar104 = vshufps_avx(auVar32,auVar32,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar104);
      auVar104 = vshufps_avx(auVar6,auVar6,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar104);
      local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar95 + 0xc + lVar93)));
      auVar119 = vmulps_avx512vl(local_380,auVar122);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_360);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar112,local_340);
      local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar95 + 0xc + lVar90)));
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar114,local_3a0);
      auVar120 = vmulps_avx512vl(local_380,auVar116);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar121,local_360);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar113,local_340);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar115,local_3a0);
      auVar108 = vmulps_avx512vl(auVar118,auVar118);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar117,auVar117);
      auVar109 = vmaxps_avx512vl(auVar119,auVar120);
      auVar109 = vmulps_avx512vl(auVar109,auVar109);
      auVar108 = vmulps_avx512vl(auVar109,auVar108);
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      uVar29 = vcmpps_avx512vl(auVar110,auVar108,2);
      auVar104 = vinsertps_avx512f(auVar7,local_3a0._0_16_,0x30);
      auVar221 = auVar170._0_16_;
      auVar103 = vandps_avx512vl(auVar104,auVar221);
      auVar104 = vblendps_avx(auVar8,auVar32,8);
      auVar104 = vandps_avx512vl(auVar104,auVar221);
      auVar103 = vmaxps_avx512vl(auVar103,auVar104);
      auVar104 = vblendps_avx(auVar5,auVar6,8);
      auVar105 = vandps_avx512vl(auVar104,auVar221);
      auVar104 = vinsertps_avx512f(auVar9,local_380._0_16_,0x30);
      auVar104 = vandps_avx512vl(auVar104,auVar221);
      auVar104 = vmaxps_avx512vl(auVar105,auVar104);
      auVar104 = vmaxps_avx(auVar103,auVar104);
      auVar103 = vmovshdup_avx(auVar104);
      auVar103 = vmaxss_avx(auVar103,auVar104);
      auVar104 = vshufpd_avx(auVar104,auVar104,1);
      auVar104 = vmaxss_avx(auVar104,auVar103);
      auVar103 = vcvtsi2ss_avx512f(in_ZMM25._0_16_,iVar12);
      local_480._0_16_ = auVar103;
      auVar219._0_4_ = auVar103._0_4_;
      auVar219._4_4_ = auVar219._0_4_;
      auVar219._8_4_ = auVar219._0_4_;
      auVar219._12_4_ = auVar219._0_4_;
      auVar219._16_4_ = auVar219._0_4_;
      auVar219._20_4_ = auVar219._0_4_;
      auVar219._24_4_ = auVar219._0_4_;
      auVar219._28_4_ = auVar219._0_4_;
      uVar31 = vcmpps_avx512vl(auVar219,_DAT_01faff40,0xe);
      bVar98 = (byte)uVar29 & (byte)uVar31;
      fVar180 = auVar104._0_4_ * 4.7683716e-07;
      local_800._0_16_ = ZEXT416((uint)fVar180);
      auVar110 = auVar232._0_32_;
      local_7e0 = vpermps_avx512vl(auVar110,ZEXT1632(auVar7));
      auVar233 = ZEXT3264(local_7e0);
      local_4e0 = vpermps_avx512vl(auVar110,ZEXT1632(auVar8));
      local_500 = vpermps_avx512vl(auVar110,ZEXT1632(auVar5));
      local_520 = vpermps_avx512vl(auVar110,ZEXT1632(auVar9));
      local_7a0 = *(undefined4 *)(ray + k * 4 + 0xc0);
      uStack_79c = 0;
      uStack_798 = 0;
      uStack_794 = 0;
      local_880 = auVar102._0_8_;
      uStack_878 = auVar102._8_8_;
      local_870 = auVar32._0_8_;
      uStack_868 = auVar32._8_8_;
      local_8a0 = auVar6._0_8_;
      uStack_898 = auVar6._8_8_;
      local_890._0_4_ = auVar106._0_4_;
      fVar154 = (float)local_890;
      local_890._4_4_ = auVar106._4_4_;
      fVar171 = local_890._4_4_;
      uStack_888._0_4_ = auVar106._8_4_;
      fVar172 = (float)uStack_888;
      uStack_888._4_4_ = auVar106._12_4_;
      fVar173 = uStack_888._4_4_;
      local_890 = auVar106._0_8_;
      uStack_888 = auVar106._8_8_;
      if (bVar98 != 0) {
        in_ZMM25 = ZEXT3264(local_520);
        auVar116 = vmulps_avx512vl(local_520,auVar116);
        auVar121 = vfmadd213ps_avx512vl(auVar121,local_500,auVar116);
        auVar113 = vfmadd213ps_avx512vl(auVar113,local_4e0,auVar121);
        auVar113 = vfmadd213ps_avx512vl(auVar115,local_7e0,auVar113);
        auVar122 = vmulps_avx512vl(local_520,auVar122);
        auVar123 = vfmadd213ps_avx512vl(auVar123,local_500,auVar122);
        auVar121 = vfmadd213ps_avx512vl(auVar112,local_4e0,auVar123);
        auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1210);
        auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1694);
        auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1b18);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1f9c);
        auVar121 = vfmadd213ps_avx512vl(auVar114,local_7e0,auVar121);
        auVar114 = vmulps_avx512vl(_local_720,auVar115);
        auVar116 = vmulps_avx512vl(_local_740,auVar115);
        auVar115 = vmulps_avx512vl(local_520,auVar115);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar122,local_6e0);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar122,local_700);
        auVar122 = vfmadd231ps_avx512vl(auVar115,local_500,auVar122);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar123,local_6a0);
        auVar115 = vfmadd231ps_avx512vl(auVar116,auVar123,local_6c0);
        auVar116 = vfmadd231ps_avx512vl(auVar122,local_4e0,auVar123);
        auVar110 = vfmadd231ps_avx512vl(auVar114,auVar112,local_660);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,local_680);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1210);
        auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1b18);
        auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1f9c);
        auVar116 = vfmadd231ps_avx512vl(auVar116,local_7e0,auVar112);
        auVar112 = vmulps_avx512vl(_local_720,auVar122);
        auVar108 = vmulps_avx512vl(_local_740,auVar122);
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar170 = ZEXT1664(auVar106);
        auVar122 = vmulps_avx512vl(local_520,auVar122);
        auVar109 = vfmadd231ps_avx512vl(auVar112,auVar123,local_6e0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar123,local_700);
        auVar123 = vfmadd231ps_avx512vl(auVar122,local_500,auVar123);
        auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1694);
        auVar122 = vfmadd231ps_avx512vl(auVar109,auVar112,local_6a0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_6c0);
        auVar112 = vfmadd231ps_avx512vl(auVar123,local_4e0,auVar112);
        auVar123 = vfmadd231ps_avx512vl(auVar122,auVar114,local_660);
        auVar122 = vfmadd231ps_avx512vl(auVar108,auVar114,local_680);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_7e0,auVar114);
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar110,auVar108);
        vandps_avx512vl(auVar115,auVar108);
        auVar114 = vmaxps_avx(auVar108,auVar108);
        vandps_avx512vl(auVar116,auVar108);
        auVar114 = vmaxps_avx(auVar114,auVar108);
        auVar225._4_4_ = fVar180;
        auVar225._0_4_ = fVar180;
        auVar225._8_4_ = fVar180;
        auVar225._12_4_ = fVar180;
        auVar225._16_4_ = fVar180;
        auVar225._20_4_ = fVar180;
        auVar225._24_4_ = fVar180;
        auVar225._28_4_ = fVar180;
        uVar89 = vcmpps_avx512vl(auVar114,auVar225,1);
        bVar15 = (bool)((byte)uVar89 & 1);
        auVar124._0_4_ = (float)((uint)bVar15 * auVar117._0_4_ | (uint)!bVar15 * auVar110._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar15 * auVar117._4_4_ | (uint)!bVar15 * auVar110._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar15 * auVar117._8_4_ | (uint)!bVar15 * auVar110._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar15 * auVar117._12_4_ | (uint)!bVar15 * auVar110._12_4_);
        bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar15 * auVar117._16_4_ | (uint)!bVar15 * auVar110._16_4_);
        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar15 * auVar117._20_4_ | (uint)!bVar15 * auVar110._20_4_);
        bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar15 * auVar117._24_4_ | (uint)!bVar15 * auVar110._24_4_);
        bVar15 = SUB81(uVar89 >> 7,0);
        auVar124._28_4_ = (uint)bVar15 * auVar117._28_4_ | (uint)!bVar15 * auVar110._28_4_;
        bVar15 = (bool)((byte)uVar89 & 1);
        auVar125._0_4_ = (float)((uint)bVar15 * auVar118._0_4_ | (uint)!bVar15 * auVar115._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar15 * auVar118._4_4_ | (uint)!bVar15 * auVar115._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar15 * auVar118._8_4_ | (uint)!bVar15 * auVar115._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar15 * auVar118._12_4_ | (uint)!bVar15 * auVar115._12_4_);
        bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar15 * auVar118._16_4_ | (uint)!bVar15 * auVar115._16_4_);
        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar15 * auVar118._20_4_ | (uint)!bVar15 * auVar115._20_4_);
        bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar15 * auVar118._24_4_ | (uint)!bVar15 * auVar115._24_4_);
        bVar15 = SUB81(uVar89 >> 7,0);
        auVar125._28_4_ = (uint)bVar15 * auVar118._28_4_ | (uint)!bVar15 * auVar115._28_4_;
        vandps_avx512vl(auVar123,auVar108);
        vandps_avx512vl(auVar122,auVar108);
        auVar114 = vmaxps_avx(auVar125,auVar125);
        vandps_avx512vl(auVar112,auVar108);
        auVar114 = vmaxps_avx(auVar114,auVar125);
        uVar89 = vcmpps_avx512vl(auVar114,auVar225,1);
        bVar15 = (bool)((byte)uVar89 & 1);
        auVar126._0_4_ = (float)((uint)bVar15 * auVar117._0_4_ | (uint)!bVar15 * auVar123._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar15 * auVar117._4_4_ | (uint)!bVar15 * auVar123._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar15 * auVar117._8_4_ | (uint)!bVar15 * auVar123._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar15 * auVar117._12_4_ | (uint)!bVar15 * auVar123._12_4_);
        bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar15 * auVar117._16_4_ | (uint)!bVar15 * auVar123._16_4_);
        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar15 * auVar117._20_4_ | (uint)!bVar15 * auVar123._20_4_);
        bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar15 * auVar117._24_4_ | (uint)!bVar15 * auVar123._24_4_);
        bVar15 = SUB81(uVar89 >> 7,0);
        auVar126._28_4_ = (uint)bVar15 * auVar117._28_4_ | (uint)!bVar15 * auVar123._28_4_;
        bVar15 = (bool)((byte)uVar89 & 1);
        auVar127._0_4_ = (float)((uint)bVar15 * auVar118._0_4_ | (uint)!bVar15 * auVar122._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar15 * auVar118._4_4_ | (uint)!bVar15 * auVar122._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar15 * auVar118._8_4_ | (uint)!bVar15 * auVar122._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar15 * auVar118._12_4_ | (uint)!bVar15 * auVar122._12_4_);
        bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar15 * auVar118._16_4_ | (uint)!bVar15 * auVar122._16_4_);
        bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar15 * auVar118._20_4_ | (uint)!bVar15 * auVar122._20_4_);
        bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar15 * auVar118._24_4_ | (uint)!bVar15 * auVar122._24_4_);
        bVar15 = SUB81(uVar89 >> 7,0);
        auVar127._28_4_ = (uint)bVar15 * auVar118._28_4_ | (uint)!bVar15 * auVar122._28_4_;
        auVar107 = vxorps_avx512vl(local_6a0._0_16_,local_6a0._0_16_);
        auVar114 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar107));
        auVar106 = vfmadd231ps_fma(auVar114,auVar125,auVar125);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar106));
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar122 = vmulps_avx512vl(ZEXT1632(auVar106),auVar123);
        fVar180 = auVar114._0_4_;
        fVar174 = auVar114._4_4_;
        fVar175 = auVar114._8_4_;
        fVar176 = auVar114._12_4_;
        fVar191 = auVar114._16_4_;
        fVar200 = auVar114._20_4_;
        fVar201 = auVar114._24_4_;
        auVar40._4_4_ = fVar174 * fVar174 * fVar174 * auVar122._4_4_;
        auVar40._0_4_ = fVar180 * fVar180 * fVar180 * auVar122._0_4_;
        auVar40._8_4_ = fVar175 * fVar175 * fVar175 * auVar122._8_4_;
        auVar40._12_4_ = fVar176 * fVar176 * fVar176 * auVar122._12_4_;
        auVar40._16_4_ = fVar191 * fVar191 * fVar191 * auVar122._16_4_;
        auVar40._20_4_ = fVar200 * fVar200 * fVar200 * auVar122._20_4_;
        auVar40._24_4_ = fVar201 * fVar201 * fVar201 * auVar122._24_4_;
        auVar40._28_4_ = auVar112._28_4_;
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar114 = vfmadd231ps_avx512vl(auVar40,auVar112,auVar114);
        auVar41._4_4_ = auVar125._4_4_ * auVar114._4_4_;
        auVar41._0_4_ = auVar125._0_4_ * auVar114._0_4_;
        auVar41._8_4_ = auVar125._8_4_ * auVar114._8_4_;
        auVar41._12_4_ = auVar125._12_4_ * auVar114._12_4_;
        auVar41._16_4_ = auVar125._16_4_ * auVar114._16_4_;
        auVar41._20_4_ = auVar125._20_4_ * auVar114._20_4_;
        auVar41._24_4_ = auVar125._24_4_ * auVar114._24_4_;
        auVar41._28_4_ = auVar122._28_4_;
        auVar42._4_4_ = auVar114._4_4_ * -auVar124._4_4_;
        auVar42._0_4_ = auVar114._0_4_ * -auVar124._0_4_;
        auVar42._8_4_ = auVar114._8_4_ * -auVar124._8_4_;
        auVar42._12_4_ = auVar114._12_4_ * -auVar124._12_4_;
        auVar42._16_4_ = auVar114._16_4_ * -auVar124._16_4_;
        auVar42._20_4_ = auVar114._20_4_ * -auVar124._20_4_;
        auVar42._24_4_ = auVar114._24_4_ * -auVar124._24_4_;
        auVar42._28_4_ = auVar125._28_4_;
        auVar122 = vmulps_avx512vl(auVar114,ZEXT1632(auVar107));
        auVar116 = ZEXT1632(auVar107);
        auVar115 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar116);
        auVar106 = vfmadd231ps_fma(auVar115,auVar127,auVar127);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar106));
        auVar123 = vmulps_avx512vl(ZEXT1632(auVar106),auVar123);
        fVar180 = auVar115._0_4_;
        fVar174 = auVar115._4_4_;
        fVar175 = auVar115._8_4_;
        fVar176 = auVar115._12_4_;
        fVar191 = auVar115._16_4_;
        fVar200 = auVar115._20_4_;
        fVar201 = auVar115._24_4_;
        auVar43._4_4_ = fVar174 * fVar174 * fVar174 * auVar123._4_4_;
        auVar43._0_4_ = fVar180 * fVar180 * fVar180 * auVar123._0_4_;
        auVar43._8_4_ = fVar175 * fVar175 * fVar175 * auVar123._8_4_;
        auVar43._12_4_ = fVar176 * fVar176 * fVar176 * auVar123._12_4_;
        auVar43._16_4_ = fVar191 * fVar191 * fVar191 * auVar123._16_4_;
        auVar43._20_4_ = fVar200 * fVar200 * fVar200 * auVar123._20_4_;
        auVar43._24_4_ = fVar201 * fVar201 * fVar201 * auVar123._24_4_;
        auVar43._28_4_ = auVar114._28_4_;
        auVar114 = vfmadd231ps_avx512vl(auVar43,auVar112,auVar115);
        auVar44._4_4_ = auVar127._4_4_ * auVar114._4_4_;
        auVar44._0_4_ = auVar127._0_4_ * auVar114._0_4_;
        auVar44._8_4_ = auVar127._8_4_ * auVar114._8_4_;
        auVar44._12_4_ = auVar127._12_4_ * auVar114._12_4_;
        auVar44._16_4_ = auVar127._16_4_ * auVar114._16_4_;
        auVar44._20_4_ = auVar127._20_4_ * auVar114._20_4_;
        auVar44._24_4_ = auVar127._24_4_ * auVar114._24_4_;
        auVar44._28_4_ = auVar123._28_4_;
        auVar45._4_4_ = auVar114._4_4_ * -auVar126._4_4_;
        auVar45._0_4_ = auVar114._0_4_ * -auVar126._0_4_;
        auVar45._8_4_ = auVar114._8_4_ * -auVar126._8_4_;
        auVar45._12_4_ = auVar114._12_4_ * -auVar126._12_4_;
        auVar45._16_4_ = auVar114._16_4_ * -auVar126._16_4_;
        auVar45._20_4_ = auVar114._20_4_ * -auVar126._20_4_;
        auVar45._24_4_ = auVar114._24_4_ * -auVar126._24_4_;
        auVar45._28_4_ = auVar115._28_4_;
        auVar114 = vmulps_avx512vl(auVar114,auVar116);
        auVar106 = vfmadd213ps_fma(auVar41,auVar119,ZEXT1632(auVar177));
        auVar104 = vfmadd213ps_fma(auVar42,auVar119,ZEXT1632(auVar181));
        auVar123 = vfmadd213ps_avx512vl(auVar122,auVar119,auVar121);
        auVar115 = vfmadd213ps_avx512vl(auVar44,auVar120,ZEXT1632(auVar182));
        auVar177 = vfnmadd213ps_fma(auVar41,auVar119,ZEXT1632(auVar177));
        auVar103 = vfmadd213ps_fma(auVar45,auVar120,ZEXT1632(auVar183));
        auVar181 = vfnmadd213ps_fma(auVar42,auVar119,ZEXT1632(auVar181));
        auVar5 = vfmadd213ps_fma(auVar114,auVar120,auVar113);
        auVar105 = vfnmadd231ps_fma(auVar121,auVar119,auVar122);
        auVar182 = vfnmadd213ps_fma(auVar44,auVar120,ZEXT1632(auVar182));
        auVar183 = vfnmadd213ps_fma(auVar45,auVar120,ZEXT1632(auVar183));
        auVar221 = vfnmadd231ps_fma(auVar113,auVar120,auVar114);
        auVar113 = vsubps_avx512vl(auVar115,ZEXT1632(auVar177));
        auVar114 = vsubps_avx(ZEXT1632(auVar103),ZEXT1632(auVar181));
        auVar112 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar105));
        auVar46._4_4_ = auVar114._4_4_ * auVar105._4_4_;
        auVar46._0_4_ = auVar114._0_4_ * auVar105._0_4_;
        auVar46._8_4_ = auVar114._8_4_ * auVar105._8_4_;
        auVar46._12_4_ = auVar114._12_4_ * auVar105._12_4_;
        auVar46._16_4_ = auVar114._16_4_ * 0.0;
        auVar46._20_4_ = auVar114._20_4_ * 0.0;
        auVar46._24_4_ = auVar114._24_4_ * 0.0;
        auVar46._28_4_ = auVar122._28_4_;
        auVar7 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar181),auVar112);
        auVar47._4_4_ = auVar112._4_4_ * auVar177._4_4_;
        auVar47._0_4_ = auVar112._0_4_ * auVar177._0_4_;
        auVar47._8_4_ = auVar112._8_4_ * auVar177._8_4_;
        auVar47._12_4_ = auVar112._12_4_ * auVar177._12_4_;
        auVar47._16_4_ = auVar112._16_4_ * 0.0;
        auVar47._20_4_ = auVar112._20_4_ * 0.0;
        auVar47._24_4_ = auVar112._24_4_ * 0.0;
        auVar47._28_4_ = auVar112._28_4_;
        auVar8 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar105),auVar113);
        auVar48._4_4_ = auVar181._4_4_ * auVar113._4_4_;
        auVar48._0_4_ = auVar181._0_4_ * auVar113._0_4_;
        auVar48._8_4_ = auVar181._8_4_ * auVar113._8_4_;
        auVar48._12_4_ = auVar181._12_4_ * auVar113._12_4_;
        auVar48._16_4_ = auVar113._16_4_ * 0.0;
        auVar48._20_4_ = auVar113._20_4_ * 0.0;
        auVar48._24_4_ = auVar113._24_4_ * 0.0;
        auVar48._28_4_ = auVar113._28_4_;
        auVar9 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar177),auVar114);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar116,ZEXT1632(auVar8));
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,ZEXT1632(auVar7));
        auVar108 = ZEXT1632(auVar107);
        uVar89 = vcmpps_avx512vl(auVar114,auVar108,2);
        bVar88 = (byte)uVar89;
        fVar100 = (float)((uint)(bVar88 & 1) * auVar106._0_4_ |
                         (uint)!(bool)(bVar88 & 1) * auVar182._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar148 = (float)((uint)bVar15 * auVar106._4_4_ | (uint)!bVar15 * auVar182._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar150 = (float)((uint)bVar15 * auVar106._8_4_ | (uint)!bVar15 * auVar182._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar152 = (float)((uint)bVar15 * auVar106._12_4_ | (uint)!bVar15 * auVar182._12_4_);
        auVar121 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar100))));
        fVar101 = (float)((uint)(bVar88 & 1) * auVar104._0_4_ |
                         (uint)!(bool)(bVar88 & 1) * auVar183._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar149 = (float)((uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar183._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar151 = (float)((uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar183._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar153 = (float)((uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar183._12_4_);
        auVar116 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar149,fVar101))));
        auVar128._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar123._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar221._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar15 * auVar123._4_4_ | (uint)!bVar15 * auVar221._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar15 * auVar123._8_4_ | (uint)!bVar15 * auVar221._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar15 * auVar123._12_4_ | (uint)!bVar15 * auVar221._12_4_);
        fVar174 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar123._16_4_);
        auVar128._16_4_ = fVar174;
        fVar180 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar123._20_4_);
        auVar128._20_4_ = fVar180;
        fVar175 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar123._24_4_);
        auVar128._24_4_ = fVar175;
        iVar1 = (uint)(byte)(uVar89 >> 7) * auVar123._28_4_;
        auVar128._28_4_ = iVar1;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar177),auVar115);
        auVar129._0_4_ =
             (uint)(bVar88 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar106._0_4_;
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * auVar106._4_4_;
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * auVar106._8_4_;
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * auVar106._12_4_;
        auVar129._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar114._16_4_;
        auVar129._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar114._20_4_;
        auVar129._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar114._24_4_;
        auVar129._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar181),ZEXT1632(auVar103));
        auVar130._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar7._0_4_)
        ;
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * auVar7._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * auVar7._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * auVar7._12_4_);
        fVar176 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar114._16_4_);
        auVar130._16_4_ = fVar176;
        fVar191 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar114._20_4_);
        auVar130._20_4_ = fVar191;
        fVar200 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar114._24_4_);
        auVar130._24_4_ = fVar200;
        auVar130._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar105),ZEXT1632(auVar5));
        auVar131._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar104._0_4_);
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * auVar104._4_4_);
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * auVar104._8_4_);
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * auVar104._12_4_);
        fVar201 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar114._16_4_);
        auVar131._16_4_ = fVar201;
        fVar202 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar114._20_4_);
        auVar131._20_4_ = fVar202;
        fVar203 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar114._24_4_);
        auVar131._24_4_ = fVar203;
        iVar2 = (uint)(byte)(uVar89 >> 7) * auVar114._28_4_;
        auVar131._28_4_ = iVar2;
        auVar132._0_4_ =
             (uint)(bVar88 & 1) * (int)auVar177._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar115._0_4_;
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar15 * (int)auVar177._4_4_ | (uint)!bVar15 * auVar115._4_4_;
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar15 * (int)auVar177._8_4_ | (uint)!bVar15 * auVar115._8_4_;
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar15 * (int)auVar177._12_4_ | (uint)!bVar15 * auVar115._12_4_;
        auVar132._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar115._16_4_;
        auVar132._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar115._20_4_;
        auVar132._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar115._24_4_;
        auVar132._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar115._28_4_;
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar117 = vsubps_avx512vl(auVar132,auVar121);
        auVar112 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar181._12_4_ |
                                                 (uint)!bVar19 * auVar103._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar181._8_4_ |
                                                          (uint)!bVar17 * auVar103._8_4_,
                                                          CONCAT44((uint)bVar15 *
                                                                   (int)auVar181._4_4_ |
                                                                   (uint)!bVar15 * auVar103._4_4_,
                                                                   (uint)(bVar88 & 1) *
                                                                   (int)auVar181._0_4_ |
                                                                   (uint)!(bool)(bVar88 & 1) *
                                                                   auVar103._0_4_)))),auVar116);
        auVar213 = ZEXT3264(auVar112);
        auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar105._12_4_ |
                                                 (uint)!bVar20 * auVar5._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar105._8_4_ |
                                                          (uint)!bVar18 * auVar5._8_4_,
                                                          CONCAT44((uint)bVar16 *
                                                                   (int)auVar105._4_4_ |
                                                                   (uint)!bVar16 * auVar5._4_4_,
                                                                   (uint)(bVar88 & 1) *
                                                                   (int)auVar105._0_4_ |
                                                                   (uint)!(bool)(bVar88 & 1) *
                                                                   auVar5._0_4_)))),auVar128);
        auVar122 = vsubps_avx(auVar121,auVar129);
        auVar217 = ZEXT3264(auVar122);
        auVar115 = vsubps_avx(auVar116,auVar130);
        auVar113 = vsubps_avx(auVar128,auVar131);
        auVar49._4_4_ = auVar123._4_4_ * fVar148;
        auVar49._0_4_ = auVar123._0_4_ * fVar100;
        auVar49._8_4_ = auVar123._8_4_ * fVar150;
        auVar49._12_4_ = auVar123._12_4_ * fVar152;
        auVar49._16_4_ = auVar123._16_4_ * 0.0;
        auVar49._20_4_ = auVar123._20_4_ * 0.0;
        auVar49._24_4_ = auVar123._24_4_ * 0.0;
        auVar49._28_4_ = 0;
        auVar106 = vfmsub231ps_fma(auVar49,auVar128,auVar117);
        auVar196._0_4_ = fVar101 * auVar117._0_4_;
        auVar196._4_4_ = fVar149 * auVar117._4_4_;
        auVar196._8_4_ = fVar151 * auVar117._8_4_;
        auVar196._12_4_ = fVar153 * auVar117._12_4_;
        auVar196._16_4_ = auVar117._16_4_ * 0.0;
        auVar196._20_4_ = auVar117._20_4_ * 0.0;
        auVar196._24_4_ = auVar117._24_4_ * 0.0;
        auVar196._28_4_ = 0;
        auVar104 = vfmsub231ps_fma(auVar196,auVar121,auVar112);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar108,ZEXT1632(auVar106));
        auVar204._0_4_ = auVar112._0_4_ * auVar128._0_4_;
        auVar204._4_4_ = auVar112._4_4_ * auVar128._4_4_;
        auVar204._8_4_ = auVar112._8_4_ * auVar128._8_4_;
        auVar204._12_4_ = auVar112._12_4_ * auVar128._12_4_;
        auVar204._16_4_ = auVar112._16_4_ * fVar174;
        auVar204._20_4_ = auVar112._20_4_ * fVar180;
        auVar204._24_4_ = auVar112._24_4_ * fVar175;
        auVar204._28_4_ = 0;
        auVar106 = vfmsub231ps_fma(auVar204,auVar116,auVar123);
        auVar118 = vfmadd231ps_avx512vl(auVar114,auVar108,ZEXT1632(auVar106));
        auVar114 = vmulps_avx512vl(auVar113,auVar129);
        auVar114 = vfmsub231ps_avx512vl(auVar114,auVar122,auVar131);
        auVar50._4_4_ = auVar115._4_4_ * auVar131._4_4_;
        auVar50._0_4_ = auVar115._0_4_ * auVar131._0_4_;
        auVar50._8_4_ = auVar115._8_4_ * auVar131._8_4_;
        auVar50._12_4_ = auVar115._12_4_ * auVar131._12_4_;
        auVar50._16_4_ = auVar115._16_4_ * fVar201;
        auVar50._20_4_ = auVar115._20_4_ * fVar202;
        auVar50._24_4_ = auVar115._24_4_ * fVar203;
        auVar50._28_4_ = iVar2;
        auVar106 = vfmsub231ps_fma(auVar50,auVar130,auVar113);
        auVar205._0_4_ = auVar130._0_4_ * auVar122._0_4_;
        auVar205._4_4_ = auVar130._4_4_ * auVar122._4_4_;
        auVar205._8_4_ = auVar130._8_4_ * auVar122._8_4_;
        auVar205._12_4_ = auVar130._12_4_ * auVar122._12_4_;
        auVar205._16_4_ = fVar176 * auVar122._16_4_;
        auVar205._20_4_ = fVar191 * auVar122._20_4_;
        auVar205._24_4_ = fVar200 * auVar122._24_4_;
        auVar205._28_4_ = 0;
        auVar104 = vfmsub231ps_fma(auVar205,auVar115,auVar129);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar108,auVar114);
        auVar110 = vfmadd231ps_avx512vl(auVar114,auVar108,ZEXT1632(auVar106));
        auVar208 = ZEXT3264(auVar110);
        auVar114 = vmaxps_avx(auVar118,auVar110);
        uVar29 = vcmpps_avx512vl(auVar114,auVar108,2);
        bVar98 = bVar98 & (byte)uVar29;
        if (bVar98 != 0) {
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar228._4_4_ = uVar155;
          auVar228._0_4_ = uVar155;
          auVar228._8_4_ = uVar155;
          auVar228._12_4_ = uVar155;
          auVar228._16_4_ = uVar155;
          auVar228._20_4_ = uVar155;
          auVar228._24_4_ = uVar155;
          auVar228._28_4_ = uVar155;
          auVar231 = ZEXT3264(auVar228);
          auVar51._4_4_ = auVar113._4_4_ * auVar112._4_4_;
          auVar51._0_4_ = auVar113._0_4_ * auVar112._0_4_;
          auVar51._8_4_ = auVar113._8_4_ * auVar112._8_4_;
          auVar51._12_4_ = auVar113._12_4_ * auVar112._12_4_;
          auVar51._16_4_ = auVar113._16_4_ * auVar112._16_4_;
          auVar51._20_4_ = auVar113._20_4_ * auVar112._20_4_;
          auVar51._24_4_ = auVar113._24_4_ * auVar112._24_4_;
          auVar51._28_4_ = auVar114._28_4_;
          auVar5 = vfmsub231ps_fma(auVar51,auVar115,auVar123);
          auVar52._4_4_ = auVar123._4_4_ * auVar122._4_4_;
          auVar52._0_4_ = auVar123._0_4_ * auVar122._0_4_;
          auVar52._8_4_ = auVar123._8_4_ * auVar122._8_4_;
          auVar52._12_4_ = auVar123._12_4_ * auVar122._12_4_;
          auVar52._16_4_ = auVar123._16_4_ * auVar122._16_4_;
          auVar52._20_4_ = auVar123._20_4_ * auVar122._20_4_;
          auVar52._24_4_ = auVar123._24_4_ * auVar122._24_4_;
          auVar52._28_4_ = auVar123._28_4_;
          auVar103 = vfmsub231ps_fma(auVar52,auVar117,auVar113);
          auVar53._4_4_ = auVar115._4_4_ * auVar117._4_4_;
          auVar53._0_4_ = auVar115._0_4_ * auVar117._0_4_;
          auVar53._8_4_ = auVar115._8_4_ * auVar117._8_4_;
          auVar53._12_4_ = auVar115._12_4_ * auVar117._12_4_;
          auVar53._16_4_ = auVar115._16_4_ * auVar117._16_4_;
          auVar53._20_4_ = auVar115._20_4_ * auVar117._20_4_;
          auVar53._24_4_ = auVar115._24_4_ * auVar117._24_4_;
          auVar53._28_4_ = auVar115._28_4_;
          auVar7 = vfmsub231ps_fma(auVar53,auVar122,auVar112);
          auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar7));
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar5),
                                     ZEXT1232(ZEXT412(0)) << 0x20);
          auVar114 = vrcp14ps_avx512vl(ZEXT1632(auVar104));
          auVar33._8_4_ = 0x3f800000;
          auVar33._0_8_ = 0x3f8000003f800000;
          auVar33._12_4_ = 0x3f800000;
          auVar33._16_4_ = 0x3f800000;
          auVar33._20_4_ = 0x3f800000;
          auVar33._24_4_ = 0x3f800000;
          auVar33._28_4_ = 0x3f800000;
          auVar112 = vfnmadd213ps_avx512vl(auVar114,ZEXT1632(auVar104),auVar33);
          auVar106 = vfmadd132ps_fma(auVar112,auVar114,auVar114);
          auVar213 = ZEXT1664(auVar106);
          auVar54._4_4_ = auVar7._4_4_ * auVar128._4_4_;
          auVar54._0_4_ = auVar7._0_4_ * auVar128._0_4_;
          auVar54._8_4_ = auVar7._8_4_ * auVar128._8_4_;
          auVar54._12_4_ = auVar7._12_4_ * auVar128._12_4_;
          auVar54._16_4_ = fVar174 * 0.0;
          auVar54._20_4_ = fVar180 * 0.0;
          auVar54._24_4_ = fVar175 * 0.0;
          auVar54._28_4_ = iVar1;
          auVar103 = vfmadd231ps_fma(auVar54,auVar116,ZEXT1632(auVar103));
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar121,ZEXT1632(auVar5));
          fVar180 = auVar106._0_4_;
          fVar174 = auVar106._4_4_;
          fVar175 = auVar106._8_4_;
          fVar176 = auVar106._12_4_;
          local_600._28_4_ = auVar114._28_4_;
          local_600._0_28_ =
               ZEXT1628(CONCAT412(auVar103._12_4_ * fVar176,
                                  CONCAT48(auVar103._8_4_ * fVar175,
                                           CONCAT44(auVar103._4_4_ * fVar174,
                                                    auVar103._0_4_ * fVar180))));
          auVar217 = ZEXT3264(local_600);
          auVar162._4_4_ = local_7a0;
          auVar162._0_4_ = local_7a0;
          auVar162._8_4_ = local_7a0;
          auVar162._12_4_ = local_7a0;
          auVar162._16_4_ = local_7a0;
          auVar162._20_4_ = local_7a0;
          auVar162._24_4_ = local_7a0;
          auVar162._28_4_ = local_7a0;
          uVar29 = vcmpps_avx512vl(local_600,auVar228,2);
          uVar31 = vcmpps_avx512vl(auVar162,local_600,2);
          bVar98 = (byte)uVar29 & (byte)uVar31 & bVar98;
          if (bVar98 != 0) {
            uVar99 = vcmpps_avx512vl(ZEXT1632(auVar104),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar99 = bVar98 & uVar99;
            if ((char)uVar99 != '\0') {
              fVar191 = auVar118._0_4_ * fVar180;
              fVar200 = auVar118._4_4_ * fVar174;
              auVar55._4_4_ = fVar200;
              auVar55._0_4_ = fVar191;
              fVar201 = auVar118._8_4_ * fVar175;
              auVar55._8_4_ = fVar201;
              fVar202 = auVar118._12_4_ * fVar176;
              auVar55._12_4_ = fVar202;
              fVar203 = auVar118._16_4_ * 0.0;
              auVar55._16_4_ = fVar203;
              fVar100 = auVar118._20_4_ * 0.0;
              auVar55._20_4_ = fVar100;
              fVar101 = auVar118._24_4_ * 0.0;
              auVar55._24_4_ = fVar101;
              auVar55._28_4_ = auVar118._28_4_;
              auVar163._8_4_ = 0x3f800000;
              auVar163._0_8_ = 0x3f8000003f800000;
              auVar163._12_4_ = 0x3f800000;
              auVar163._16_4_ = 0x3f800000;
              auVar163._20_4_ = 0x3f800000;
              auVar163._24_4_ = 0x3f800000;
              auVar163._28_4_ = 0x3f800000;
              auVar114 = vsubps_avx(auVar163,auVar55);
              local_640._0_4_ =
                   (float)((uint)(bVar88 & 1) * (int)fVar191 |
                          (uint)!(bool)(bVar88 & 1) * auVar114._0_4_);
              bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
              local_640._4_4_ =
                   (float)((uint)bVar15 * (int)fVar200 | (uint)!bVar15 * auVar114._4_4_);
              bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
              local_640._8_4_ =
                   (float)((uint)bVar15 * (int)fVar201 | (uint)!bVar15 * auVar114._8_4_);
              bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
              local_640._12_4_ =
                   (float)((uint)bVar15 * (int)fVar202 | (uint)!bVar15 * auVar114._12_4_);
              bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
              local_640._16_4_ =
                   (float)((uint)bVar15 * (int)fVar203 | (uint)!bVar15 * auVar114._16_4_);
              bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
              local_640._20_4_ =
                   (float)((uint)bVar15 * (int)fVar100 | (uint)!bVar15 * auVar114._20_4_);
              bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
              local_640._24_4_ =
                   (float)((uint)bVar15 * (int)fVar101 | (uint)!bVar15 * auVar114._24_4_);
              bVar15 = SUB81(uVar89 >> 7,0);
              local_640._28_4_ =
                   (float)((uint)bVar15 * auVar118._28_4_ | (uint)!bVar15 * auVar114._28_4_);
              auVar114 = vsubps_avx(auVar120,auVar119);
              auVar106 = vfmadd213ps_fma(auVar114,local_640,auVar119);
              uVar155 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar34._4_4_ = uVar155;
              auVar34._0_4_ = uVar155;
              auVar34._8_4_ = uVar155;
              auVar34._12_4_ = uVar155;
              auVar34._16_4_ = uVar155;
              auVar34._20_4_ = uVar155;
              auVar34._24_4_ = uVar155;
              auVar34._28_4_ = uVar155;
              auVar114 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar106._12_4_ + auVar106._12_4_,
                                                            CONCAT48(auVar106._8_4_ + auVar106._8_4_
                                                                     ,CONCAT44(auVar106._4_4_ +
                                                                               auVar106._4_4_,
                                                                               auVar106._0_4_ +
                                                                               auVar106._0_4_)))),
                                         auVar34);
              uVar30 = vcmpps_avx512vl(local_600,auVar114,6);
              uVar99 = uVar99 & uVar30;
              bVar98 = (byte)uVar99;
              if (bVar98 != 0) {
                auVar189._0_4_ = auVar110._0_4_ * fVar180;
                auVar189._4_4_ = auVar110._4_4_ * fVar174;
                auVar189._8_4_ = auVar110._8_4_ * fVar175;
                auVar189._12_4_ = auVar110._12_4_ * fVar176;
                auVar189._16_4_ = auVar110._16_4_ * 0.0;
                auVar189._20_4_ = auVar110._20_4_ * 0.0;
                auVar189._24_4_ = auVar110._24_4_ * 0.0;
                auVar189._28_4_ = 0;
                auVar197._8_4_ = 0x3f800000;
                auVar197._0_8_ = 0x3f8000003f800000;
                auVar197._12_4_ = 0x3f800000;
                auVar197._16_4_ = 0x3f800000;
                auVar197._20_4_ = 0x3f800000;
                auVar197._24_4_ = 0x3f800000;
                auVar197._28_4_ = 0x3f800000;
                auVar114 = vsubps_avx(auVar197,auVar189);
                auVar133._0_4_ =
                     (uint)(bVar88 & 1) * (int)auVar189._0_4_ |
                     (uint)!(bool)(bVar88 & 1) * auVar114._0_4_;
                bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
                auVar133._4_4_ = (uint)bVar15 * (int)auVar189._4_4_ | (uint)!bVar15 * auVar114._4_4_
                ;
                bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
                auVar133._8_4_ = (uint)bVar15 * (int)auVar189._8_4_ | (uint)!bVar15 * auVar114._8_4_
                ;
                bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
                auVar133._12_4_ =
                     (uint)bVar15 * (int)auVar189._12_4_ | (uint)!bVar15 * auVar114._12_4_;
                bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                auVar133._16_4_ =
                     (uint)bVar15 * (int)auVar189._16_4_ | (uint)!bVar15 * auVar114._16_4_;
                bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                auVar133._20_4_ =
                     (uint)bVar15 * (int)auVar189._20_4_ | (uint)!bVar15 * auVar114._20_4_;
                bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
                auVar133._24_4_ =
                     (uint)bVar15 * (int)auVar189._24_4_ | (uint)!bVar15 * auVar114._24_4_;
                auVar133._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar114._28_4_;
                auVar35._8_4_ = 0x40000000;
                auVar35._0_8_ = 0x4000000040000000;
                auVar35._12_4_ = 0x40000000;
                auVar35._16_4_ = 0x40000000;
                auVar35._20_4_ = 0x40000000;
                auVar35._24_4_ = 0x40000000;
                auVar35._28_4_ = 0x40000000;
                local_620 = vfmsub132ps_avx512vl(auVar133,auVar197,auVar35);
                local_5e0 = 0;
                local_5d0 = local_880;
                uStack_5c8 = uStack_878;
                local_5c0 = local_870;
                uStack_5b8 = uStack_868;
                local_5b0 = local_8a0;
                uStack_5a8 = uStack_898;
                local_5a0 = local_890;
                uStack_598 = uStack_888;
                if ((pGVar96->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar180 = 1.0 / auVar219._0_4_;
                  local_580[0] = fVar180 * (local_640._0_4_ + 0.0);
                  local_580[1] = fVar180 * (local_640._4_4_ + 1.0);
                  local_580[2] = fVar180 * (local_640._8_4_ + 2.0);
                  local_580[3] = fVar180 * (local_640._12_4_ + 3.0);
                  fStack_570 = fVar180 * (local_640._16_4_ + 4.0);
                  fStack_56c = fVar180 * (local_640._20_4_ + 5.0);
                  fStack_568 = fVar180 * (local_640._24_4_ + 6.0);
                  fStack_564 = local_640._28_4_ + 7.0;
                  local_560 = local_620;
                  local_540 = local_600;
                  auVar164._8_4_ = 0x7f800000;
                  auVar164._0_8_ = 0x7f8000007f800000;
                  auVar164._12_4_ = 0x7f800000;
                  auVar164._16_4_ = 0x7f800000;
                  auVar164._20_4_ = 0x7f800000;
                  auVar164._24_4_ = 0x7f800000;
                  auVar164._28_4_ = 0x7f800000;
                  auVar114 = vblendmps_avx512vl(auVar164,local_600);
                  auVar134._0_4_ =
                       (uint)(bVar98 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar98 & 1) * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar99 >> 1) & 1);
                  auVar134._4_4_ = (uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar99 >> 2) & 1);
                  auVar134._8_4_ = (uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar99 >> 3) & 1);
                  auVar134._12_4_ = (uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar99 >> 4) & 1);
                  auVar134._16_4_ = (uint)bVar15 * auVar114._16_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar99 >> 5) & 1);
                  auVar134._20_4_ = (uint)bVar15 * auVar114._20_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = (bool)((byte)(uVar99 >> 6) & 1);
                  auVar134._24_4_ = (uint)bVar15 * auVar114._24_4_ | (uint)!bVar15 * 0x7f800000;
                  bVar15 = SUB81(uVar99 >> 7,0);
                  auVar134._28_4_ = (uint)bVar15 * auVar114._28_4_ | (uint)!bVar15 * 0x7f800000;
                  auVar114 = vshufps_avx(auVar134,auVar134,0xb1);
                  auVar114 = vminps_avx(auVar134,auVar114);
                  auVar112 = vshufpd_avx(auVar114,auVar114,5);
                  auVar114 = vminps_avx(auVar114,auVar112);
                  auVar112 = vpermpd_avx2(auVar114,0x4e);
                  auVar114 = vminps_avx(auVar114,auVar112);
                  uVar29 = vcmpps_avx512vl(auVar134,auVar114,0);
                  uVar91 = (uint)uVar99;
                  if (((byte)uVar29 & bVar98) != 0) {
                    uVar91 = (uint)((byte)uVar29 & bVar98);
                  }
                  uVar92 = 0;
                  for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                    uVar92 = uVar92 + 1;
                  }
                  uVar89 = (ulong)uVar92;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar208 = vpbroadcastd_avx512f();
                    local_440 = vmovdqa64_avx512f(auVar208);
                    auVar208 = vpbroadcastd_avx512f();
                    local_4c0 = vmovdqa64_avx512f(auVar208);
                    local_820 = local_600;
                    local_5dc = iVar12;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[uVar89]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + uVar89 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar89 * 4)
                      ;
                      local_858.context = context->user;
                      fVar176 = local_200._0_4_;
                      fVar174 = 1.0 - fVar176;
                      fVar180 = fVar174 * fVar174 * -3.0;
                      auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),
                                                 ZEXT416((uint)(fVar176 * fVar174)),
                                                 ZEXT416(0xc0000000));
                      auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar176 * fVar174)),
                                                 ZEXT416((uint)(fVar176 * fVar176)),
                                                 ZEXT416(0x40000000));
                      fVar174 = auVar106._0_4_ * 3.0;
                      fVar175 = auVar104._0_4_ * 3.0;
                      fVar176 = fVar176 * fVar176 * 3.0;
                      auVar212._0_4_ = fVar176 * fVar154;
                      auVar212._4_4_ = fVar176 * fVar171;
                      auVar212._8_4_ = fVar176 * fVar172;
                      auVar212._12_4_ = fVar176 * fVar173;
                      auVar158._4_4_ = fVar175;
                      auVar158._0_4_ = fVar175;
                      auVar158._8_4_ = fVar175;
                      auVar158._12_4_ = fVar175;
                      auVar106 = vfmadd132ps_fma(auVar158,auVar212,auVar6);
                      auVar195._4_4_ = fVar174;
                      auVar195._0_4_ = fVar174;
                      auVar195._8_4_ = fVar174;
                      auVar195._12_4_ = fVar174;
                      auVar106 = vfmadd132ps_fma(auVar195,auVar106,auVar32);
                      auVar159._4_4_ = fVar180;
                      auVar159._0_4_ = fVar180;
                      auVar159._8_4_ = fVar180;
                      auVar159._12_4_ = fVar180;
                      auVar106 = vfmadd132ps_fma(auVar159,auVar106,auVar102);
                      auVar234 = vbroadcastss_avx512f(auVar106);
                      auVar208 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar208 = vpermps_avx512f(auVar208,ZEXT1664(auVar106));
                      auVar213 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar213,ZEXT1664(auVar106));
                      local_2c0[0] = (RTCHitN)auVar234[0];
                      local_2c0[1] = (RTCHitN)auVar234[1];
                      local_2c0[2] = (RTCHitN)auVar234[2];
                      local_2c0[3] = (RTCHitN)auVar234[3];
                      local_2c0[4] = (RTCHitN)auVar234[4];
                      local_2c0[5] = (RTCHitN)auVar234[5];
                      local_2c0[6] = (RTCHitN)auVar234[6];
                      local_2c0[7] = (RTCHitN)auVar234[7];
                      local_2c0[8] = (RTCHitN)auVar234[8];
                      local_2c0[9] = (RTCHitN)auVar234[9];
                      local_2c0[10] = (RTCHitN)auVar234[10];
                      local_2c0[0xb] = (RTCHitN)auVar234[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar234[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar234[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar234[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar234[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar234[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar234[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar234[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar234[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar234[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar234[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar234[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar234[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar234[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar234[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar234[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar234[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar234[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar234[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar234[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar234[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar234[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar234[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar234[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar234[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar234[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar234[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar234[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar234[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar234[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar234[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar234[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar234[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar234[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar234[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar234[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar234[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar234[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar234[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar234[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar234[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar234[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar234[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar234[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar234[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar234[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar234[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar234[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar234[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar234[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar234[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar234[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar234[0x3f];
                      local_280 = auVar208;
                      local_180 = local_4c0._0_8_;
                      uStack_178 = local_4c0._8_8_;
                      uStack_170 = local_4c0._16_8_;
                      uStack_168 = local_4c0._24_8_;
                      uStack_160 = local_4c0._32_8_;
                      uStack_158 = local_4c0._40_8_;
                      uStack_150 = local_4c0._48_8_;
                      uStack_148 = local_4c0._56_8_;
                      auVar234 = vmovdqa64_avx512f(local_440);
                      local_140 = vmovdqa64_avx512f(auVar234);
                      auVar114 = vpcmpeqd_avx2(auVar234._0_32_,auVar234._0_32_);
                      local_828[3] = auVar114;
                      local_828[2] = auVar114;
                      local_828[1] = auVar114;
                      *local_828 = auVar114;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_858.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_858.context)->instPrimID[0]));
                      auVar234 = vmovdqa64_avx512f(local_300);
                      local_780 = vmovdqa64_avx512f(auVar234);
                      local_858.valid = (int *)local_780;
                      local_858.geometryUserPtr = pGVar96->userPtr;
                      local_858.hit = local_2c0;
                      local_858.N = 0x10;
                      local_7c0 = auVar231._0_32_;
                      local_858.ray = (RTCRayN *)ray;
                      if (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar208 = ZEXT1664(auVar208._0_16_);
                        auVar213 = ZEXT1664(auVar213._0_16_);
                        (*pGVar96->intersectionFilterN)(&local_858);
                        auVar217 = ZEXT3264(local_820);
                        auVar231 = ZEXT3264(local_7c0);
                        auVar233 = ZEXT3264(local_7e0);
                        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar170 = ZEXT1664(auVar106);
                        auVar114 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar232 = ZEXT3264(auVar114);
                        auVar234 = vmovdqa64_avx512f(local_780);
                      }
                      uVar29 = vptestmd_avx512f(auVar234,auVar234);
                      if ((short)uVar29 == 0) {
LAB_01cf7580:
                        *(int *)(ray + k * 4 + 0x200) = auVar231._0_4_;
                      }
                      else {
                        p_Var14 = context->args->filter;
                        if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar96->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar208 = ZEXT1664(auVar208._0_16_);
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          (*p_Var14)(&local_858);
                          auVar217 = ZEXT3264(local_820);
                          auVar231 = ZEXT3264(local_7c0);
                          auVar233 = ZEXT3264(local_7e0);
                          auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar170 = ZEXT1664(auVar106);
                          auVar114 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar232 = ZEXT3264(auVar114);
                          auVar234 = vmovdqa64_avx512f(local_780);
                        }
                        uVar30 = vptestmd_avx512f(auVar234,auVar234);
                        if ((short)uVar30 == 0) goto LAB_01cf7580;
                        iVar1 = *(int *)(local_858.hit + 4);
                        iVar2 = *(int *)(local_858.hit + 8);
                        iVar74 = *(int *)(local_858.hit + 0xc);
                        iVar75 = *(int *)(local_858.hit + 0x10);
                        iVar76 = *(int *)(local_858.hit + 0x14);
                        iVar77 = *(int *)(local_858.hit + 0x18);
                        iVar78 = *(int *)(local_858.hit + 0x1c);
                        iVar79 = *(int *)(local_858.hit + 0x20);
                        iVar80 = *(int *)(local_858.hit + 0x24);
                        iVar81 = *(int *)(local_858.hit + 0x28);
                        iVar82 = *(int *)(local_858.hit + 0x2c);
                        iVar83 = *(int *)(local_858.hit + 0x30);
                        iVar84 = *(int *)(local_858.hit + 0x34);
                        iVar85 = *(int *)(local_858.hit + 0x38);
                        iVar86 = *(int *)(local_858.hit + 0x3c);
                        bVar98 = (byte)uVar30;
                        bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar30 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar30 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
                        bVar21 = (bool)((byte)(uVar30 >> 7) & 1);
                        bVar88 = (byte)(uVar30 >> 8);
                        bVar22 = (bool)((byte)(uVar30 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar30 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar30 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar30 >> 0xe) & 1);
                        bVar28 = SUB81(uVar30 >> 0xf,0);
                        *(uint *)(local_858.ray + 0x300) =
                             (uint)(bVar98 & 1) * *(int *)local_858.hit |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_858.ray + 0x300);
                        *(uint *)(local_858.ray + 0x304) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_858.ray + 0x304);
                        *(uint *)(local_858.ray + 0x308) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_858.ray + 0x308);
                        *(uint *)(local_858.ray + 0x30c) =
                             (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_858.ray + 0x30c)
                        ;
                        *(uint *)(local_858.ray + 0x310) =
                             (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_858.ray + 0x310)
                        ;
                        *(uint *)(local_858.ray + 0x314) =
                             (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_858.ray + 0x314)
                        ;
                        *(uint *)(local_858.ray + 0x318) =
                             (uint)bVar20 * iVar77 | (uint)!bVar20 * *(int *)(local_858.ray + 0x318)
                        ;
                        *(uint *)(local_858.ray + 0x31c) =
                             (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_858.ray + 0x31c)
                        ;
                        *(uint *)(local_858.ray + 800) =
                             (uint)(bVar88 & 1) * iVar79 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_858.ray + 800);
                        *(uint *)(local_858.ray + 0x324) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_858.ray + 0x324)
                        ;
                        *(uint *)(local_858.ray + 0x328) =
                             (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_858.ray + 0x328)
                        ;
                        *(uint *)(local_858.ray + 0x32c) =
                             (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_858.ray + 0x32c)
                        ;
                        *(uint *)(local_858.ray + 0x330) =
                             (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_858.ray + 0x330)
                        ;
                        *(uint *)(local_858.ray + 0x334) =
                             (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_858.ray + 0x334)
                        ;
                        *(uint *)(local_858.ray + 0x338) =
                             (uint)bVar27 * iVar85 | (uint)!bVar27 * *(int *)(local_858.ray + 0x338)
                        ;
                        *(uint *)(local_858.ray + 0x33c) =
                             (uint)bVar28 * iVar86 | (uint)!bVar28 * *(int *)(local_858.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_858.hit + 0x44);
                        iVar2 = *(int *)(local_858.hit + 0x48);
                        iVar74 = *(int *)(local_858.hit + 0x4c);
                        iVar75 = *(int *)(local_858.hit + 0x50);
                        iVar76 = *(int *)(local_858.hit + 0x54);
                        iVar77 = *(int *)(local_858.hit + 0x58);
                        iVar78 = *(int *)(local_858.hit + 0x5c);
                        iVar79 = *(int *)(local_858.hit + 0x60);
                        iVar80 = *(int *)(local_858.hit + 100);
                        iVar81 = *(int *)(local_858.hit + 0x68);
                        iVar82 = *(int *)(local_858.hit + 0x6c);
                        iVar83 = *(int *)(local_858.hit + 0x70);
                        iVar84 = *(int *)(local_858.hit + 0x74);
                        iVar85 = *(int *)(local_858.hit + 0x78);
                        iVar86 = *(int *)(local_858.hit + 0x7c);
                        bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar30 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar30 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
                        bVar21 = (bool)((byte)(uVar30 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar30 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar30 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar30 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar30 >> 0xe) & 1);
                        bVar28 = SUB81(uVar30 >> 0xf,0);
                        *(uint *)(local_858.ray + 0x340) =
                             (uint)(bVar98 & 1) * *(int *)(local_858.hit + 0x40) |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_858.ray + 0x340);
                        *(uint *)(local_858.ray + 0x344) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_858.ray + 0x344);
                        *(uint *)(local_858.ray + 0x348) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_858.ray + 0x348);
                        *(uint *)(local_858.ray + 0x34c) =
                             (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_858.ray + 0x34c)
                        ;
                        *(uint *)(local_858.ray + 0x350) =
                             (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_858.ray + 0x350)
                        ;
                        *(uint *)(local_858.ray + 0x354) =
                             (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_858.ray + 0x354)
                        ;
                        *(uint *)(local_858.ray + 0x358) =
                             (uint)bVar20 * iVar77 | (uint)!bVar20 * *(int *)(local_858.ray + 0x358)
                        ;
                        *(uint *)(local_858.ray + 0x35c) =
                             (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_858.ray + 0x35c)
                        ;
                        *(uint *)(local_858.ray + 0x360) =
                             (uint)(bVar88 & 1) * iVar79 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_858.ray + 0x360);
                        *(uint *)(local_858.ray + 0x364) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_858.ray + 0x364)
                        ;
                        *(uint *)(local_858.ray + 0x368) =
                             (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_858.ray + 0x368)
                        ;
                        *(uint *)(local_858.ray + 0x36c) =
                             (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_858.ray + 0x36c)
                        ;
                        *(uint *)(local_858.ray + 0x370) =
                             (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_858.ray + 0x370)
                        ;
                        *(uint *)(local_858.ray + 0x374) =
                             (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_858.ray + 0x374)
                        ;
                        *(uint *)(local_858.ray + 0x378) =
                             (uint)bVar27 * iVar85 | (uint)!bVar27 * *(int *)(local_858.ray + 0x378)
                        ;
                        *(uint *)(local_858.ray + 0x37c) =
                             (uint)bVar28 * iVar86 | (uint)!bVar28 * *(int *)(local_858.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_858.hit + 0x84);
                        iVar2 = *(int *)(local_858.hit + 0x88);
                        iVar74 = *(int *)(local_858.hit + 0x8c);
                        iVar75 = *(int *)(local_858.hit + 0x90);
                        iVar76 = *(int *)(local_858.hit + 0x94);
                        iVar77 = *(int *)(local_858.hit + 0x98);
                        iVar78 = *(int *)(local_858.hit + 0x9c);
                        iVar79 = *(int *)(local_858.hit + 0xa0);
                        iVar80 = *(int *)(local_858.hit + 0xa4);
                        iVar81 = *(int *)(local_858.hit + 0xa8);
                        iVar82 = *(int *)(local_858.hit + 0xac);
                        iVar83 = *(int *)(local_858.hit + 0xb0);
                        iVar84 = *(int *)(local_858.hit + 0xb4);
                        iVar85 = *(int *)(local_858.hit + 0xb8);
                        iVar86 = *(int *)(local_858.hit + 0xbc);
                        bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar30 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar30 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
                        bVar21 = (bool)((byte)(uVar30 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar30 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar30 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar30 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar30 >> 0xe) & 1);
                        bVar28 = SUB81(uVar30 >> 0xf,0);
                        *(uint *)(local_858.ray + 0x380) =
                             (uint)(bVar98 & 1) * *(int *)(local_858.hit + 0x80) |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_858.ray + 0x380);
                        *(uint *)(local_858.ray + 900) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_858.ray + 900);
                        *(uint *)(local_858.ray + 0x388) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_858.ray + 0x388);
                        *(uint *)(local_858.ray + 0x38c) =
                             (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_858.ray + 0x38c)
                        ;
                        *(uint *)(local_858.ray + 0x390) =
                             (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_858.ray + 0x390)
                        ;
                        *(uint *)(local_858.ray + 0x394) =
                             (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_858.ray + 0x394)
                        ;
                        *(uint *)(local_858.ray + 0x398) =
                             (uint)bVar20 * iVar77 | (uint)!bVar20 * *(int *)(local_858.ray + 0x398)
                        ;
                        *(uint *)(local_858.ray + 0x39c) =
                             (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_858.ray + 0x39c)
                        ;
                        *(uint *)(local_858.ray + 0x3a0) =
                             (uint)(bVar88 & 1) * iVar79 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_858.ray + 0x3a0);
                        *(uint *)(local_858.ray + 0x3a4) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_858.ray + 0x3a4)
                        ;
                        *(uint *)(local_858.ray + 0x3a8) =
                             (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_858.ray + 0x3a8)
                        ;
                        *(uint *)(local_858.ray + 0x3ac) =
                             (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_858.ray + 0x3ac)
                        ;
                        *(uint *)(local_858.ray + 0x3b0) =
                             (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_858.ray + 0x3b0)
                        ;
                        *(uint *)(local_858.ray + 0x3b4) =
                             (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_858.ray + 0x3b4)
                        ;
                        *(uint *)(local_858.ray + 0x3b8) =
                             (uint)bVar27 * iVar85 | (uint)!bVar27 * *(int *)(local_858.ray + 0x3b8)
                        ;
                        *(uint *)(local_858.ray + 0x3bc) =
                             (uint)bVar28 * iVar86 | (uint)!bVar28 * *(int *)(local_858.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_858.hit + 0xc4);
                        iVar2 = *(int *)(local_858.hit + 200);
                        iVar74 = *(int *)(local_858.hit + 0xcc);
                        iVar75 = *(int *)(local_858.hit + 0xd0);
                        iVar76 = *(int *)(local_858.hit + 0xd4);
                        iVar77 = *(int *)(local_858.hit + 0xd8);
                        iVar78 = *(int *)(local_858.hit + 0xdc);
                        iVar79 = *(int *)(local_858.hit + 0xe0);
                        iVar80 = *(int *)(local_858.hit + 0xe4);
                        iVar81 = *(int *)(local_858.hit + 0xe8);
                        iVar82 = *(int *)(local_858.hit + 0xec);
                        iVar83 = *(int *)(local_858.hit + 0xf0);
                        iVar84 = *(int *)(local_858.hit + 0xf4);
                        iVar85 = *(int *)(local_858.hit + 0xf8);
                        iVar86 = *(int *)(local_858.hit + 0xfc);
                        bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar30 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar30 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
                        bVar21 = (bool)((byte)(uVar30 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar30 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar30 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar30 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar30 >> 0xe) & 1);
                        bVar28 = SUB81(uVar30 >> 0xf,0);
                        *(uint *)(local_858.ray + 0x3c0) =
                             (uint)(bVar98 & 1) * *(int *)(local_858.hit + 0xc0) |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_858.ray + 0x3c0);
                        *(uint *)(local_858.ray + 0x3c4) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_858.ray + 0x3c4);
                        *(uint *)(local_858.ray + 0x3c8) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_858.ray + 0x3c8);
                        *(uint *)(local_858.ray + 0x3cc) =
                             (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_858.ray + 0x3cc)
                        ;
                        *(uint *)(local_858.ray + 0x3d0) =
                             (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_858.ray + 0x3d0)
                        ;
                        *(uint *)(local_858.ray + 0x3d4) =
                             (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_858.ray + 0x3d4)
                        ;
                        *(uint *)(local_858.ray + 0x3d8) =
                             (uint)bVar20 * iVar77 | (uint)!bVar20 * *(int *)(local_858.ray + 0x3d8)
                        ;
                        *(uint *)(local_858.ray + 0x3dc) =
                             (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_858.ray + 0x3dc)
                        ;
                        *(uint *)(local_858.ray + 0x3e0) =
                             (uint)(bVar88 & 1) * iVar79 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_858.ray + 0x3e0);
                        *(uint *)(local_858.ray + 0x3e4) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_858.ray + 0x3e4)
                        ;
                        *(uint *)(local_858.ray + 1000) =
                             (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_858.ray + 1000);
                        *(uint *)(local_858.ray + 0x3ec) =
                             (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_858.ray + 0x3ec)
                        ;
                        *(uint *)(local_858.ray + 0x3f0) =
                             (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_858.ray + 0x3f0)
                        ;
                        *(uint *)(local_858.ray + 0x3f4) =
                             (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_858.ray + 0x3f4)
                        ;
                        *(uint *)(local_858.ray + 0x3f8) =
                             (uint)bVar27 * iVar85 | (uint)!bVar27 * *(int *)(local_858.ray + 0x3f8)
                        ;
                        *(uint *)(local_858.ray + 0x3fc) =
                             (uint)bVar28 * iVar86 | (uint)!bVar28 * *(int *)(local_858.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_858.hit + 0x104);
                        iVar2 = *(int *)(local_858.hit + 0x108);
                        iVar74 = *(int *)(local_858.hit + 0x10c);
                        iVar75 = *(int *)(local_858.hit + 0x110);
                        iVar76 = *(int *)(local_858.hit + 0x114);
                        iVar77 = *(int *)(local_858.hit + 0x118);
                        iVar78 = *(int *)(local_858.hit + 0x11c);
                        iVar79 = *(int *)(local_858.hit + 0x120);
                        iVar80 = *(int *)(local_858.hit + 0x124);
                        iVar81 = *(int *)(local_858.hit + 0x128);
                        iVar82 = *(int *)(local_858.hit + 300);
                        iVar83 = *(int *)(local_858.hit + 0x130);
                        iVar84 = *(int *)(local_858.hit + 0x134);
                        iVar85 = *(int *)(local_858.hit + 0x138);
                        iVar86 = *(int *)(local_858.hit + 0x13c);
                        bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar30 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar30 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
                        bVar21 = (bool)((byte)(uVar30 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar30 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar30 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar30 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar30 >> 0xe) & 1);
                        bVar28 = SUB81(uVar30 >> 0xf,0);
                        *(uint *)(local_858.ray + 0x400) =
                             (uint)(bVar98 & 1) * *(int *)(local_858.hit + 0x100) |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_858.ray + 0x400);
                        *(uint *)(local_858.ray + 0x404) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_858.ray + 0x404);
                        *(uint *)(local_858.ray + 0x408) =
                             (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_858.ray + 0x408);
                        *(uint *)(local_858.ray + 0x40c) =
                             (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_858.ray + 0x40c)
                        ;
                        *(uint *)(local_858.ray + 0x410) =
                             (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_858.ray + 0x410)
                        ;
                        *(uint *)(local_858.ray + 0x414) =
                             (uint)bVar19 * iVar76 | (uint)!bVar19 * *(int *)(local_858.ray + 0x414)
                        ;
                        *(uint *)(local_858.ray + 0x418) =
                             (uint)bVar20 * iVar77 | (uint)!bVar20 * *(int *)(local_858.ray + 0x418)
                        ;
                        *(uint *)(local_858.ray + 0x41c) =
                             (uint)bVar21 * iVar78 | (uint)!bVar21 * *(int *)(local_858.ray + 0x41c)
                        ;
                        *(uint *)(local_858.ray + 0x420) =
                             (uint)(bVar88 & 1) * iVar79 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_858.ray + 0x420);
                        *(uint *)(local_858.ray + 0x424) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_858.ray + 0x424)
                        ;
                        *(uint *)(local_858.ray + 0x428) =
                             (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_858.ray + 0x428)
                        ;
                        *(uint *)(local_858.ray + 0x42c) =
                             (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_858.ray + 0x42c)
                        ;
                        *(uint *)(local_858.ray + 0x430) =
                             (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_858.ray + 0x430)
                        ;
                        *(uint *)(local_858.ray + 0x434) =
                             (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_858.ray + 0x434)
                        ;
                        *(uint *)(local_858.ray + 0x438) =
                             (uint)bVar27 * iVar85 | (uint)!bVar27 * *(int *)(local_858.ray + 0x438)
                        ;
                        *(uint *)(local_858.ray + 0x43c) =
                             (uint)bVar28 * iVar86 | (uint)!bVar28 * *(int *)(local_858.ray + 0x43c)
                        ;
                        auVar231 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x140));
                        auVar231 = vmovdqu32_avx512f(auVar231);
                        *(undefined1 (*) [64])(local_858.ray + 0x440) = auVar231;
                        auVar231 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x180));
                        auVar231 = vmovdqu32_avx512f(auVar231);
                        *(undefined1 (*) [64])(local_858.ray + 0x480) = auVar231;
                        auVar231 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x1c0));
                        auVar231 = vmovdqa32_avx512f(auVar231);
                        *(undefined1 (*) [64])(local_858.ray + 0x4c0) = auVar231;
                        auVar231 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x200));
                        auVar231 = vmovdqa32_avx512f(auVar231);
                        *(undefined1 (*) [64])(local_858.ray + 0x500) = auVar231;
                        auVar231 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                      }
                      bVar98 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & (byte)uVar99;
                      uVar155 = auVar231._0_4_;
                      auVar168._4_4_ = uVar155;
                      auVar168._0_4_ = uVar155;
                      auVar168._8_4_ = uVar155;
                      auVar168._12_4_ = uVar155;
                      auVar168._16_4_ = uVar155;
                      auVar168._20_4_ = uVar155;
                      auVar168._24_4_ = uVar155;
                      auVar168._28_4_ = uVar155;
                      uVar29 = vcmpps_avx512vl(auVar217._0_32_,auVar168,2);
                      if ((bVar98 & (byte)uVar29) == 0) goto LAB_01cf64a7;
                      bVar98 = bVar98 & (byte)uVar29;
                      uVar99 = (ulong)bVar98;
                      auVar169._8_4_ = 0x7f800000;
                      auVar169._0_8_ = 0x7f8000007f800000;
                      auVar169._12_4_ = 0x7f800000;
                      auVar169._16_4_ = 0x7f800000;
                      auVar169._20_4_ = 0x7f800000;
                      auVar169._24_4_ = 0x7f800000;
                      auVar169._28_4_ = 0x7f800000;
                      auVar114 = vblendmps_avx512vl(auVar169,auVar217._0_32_);
                      auVar147._0_4_ =
                           (uint)(bVar98 & 1) * auVar114._0_4_ |
                           (uint)!(bool)(bVar98 & 1) * 0x7f800000;
                      bVar15 = (bool)(bVar98 >> 1 & 1);
                      auVar147._4_4_ = (uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar98 >> 2 & 1);
                      auVar147._8_4_ = (uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar98 >> 3 & 1);
                      auVar147._12_4_ = (uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar98 >> 4 & 1);
                      auVar147._16_4_ = (uint)bVar15 * auVar114._16_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar98 >> 5 & 1);
                      auVar147._20_4_ = (uint)bVar15 * auVar114._20_4_ | (uint)!bVar15 * 0x7f800000;
                      bVar15 = (bool)(bVar98 >> 6 & 1);
                      auVar147._24_4_ = (uint)bVar15 * auVar114._24_4_ | (uint)!bVar15 * 0x7f800000;
                      auVar147._28_4_ =
                           (uint)(bVar98 >> 7) * auVar114._28_4_ |
                           (uint)!(bool)(bVar98 >> 7) * 0x7f800000;
                      auVar114 = vshufps_avx(auVar147,auVar147,0xb1);
                      auVar114 = vminps_avx(auVar147,auVar114);
                      auVar112 = vshufpd_avx(auVar114,auVar114,5);
                      auVar114 = vminps_avx(auVar114,auVar112);
                      auVar112 = vpermpd_avx2(auVar114,0x4e);
                      auVar114 = vminps_avx(auVar114,auVar112);
                      uVar29 = vcmpps_avx512vl(auVar147,auVar114,0);
                      bVar88 = (byte)uVar29 & bVar98;
                      if (bVar88 != 0) {
                        bVar98 = bVar88;
                      }
                      uVar91 = 0;
                      for (uVar92 = (uint)bVar98; (uVar92 & 1) == 0;
                          uVar92 = uVar92 >> 1 | 0x80000000) {
                        uVar91 = uVar91 + 1;
                      }
                      uVar89 = (ulong)uVar91;
                    } while( true );
                  }
                  fVar180 = local_580[uVar89];
                  uVar155 = *(undefined4 *)(local_560 + uVar89 * 4);
                  fVar175 = 1.0 - fVar180;
                  fVar174 = fVar175 * fVar175 * -3.0;
                  auVar208 = ZEXT464((uint)fVar174);
                  auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar175 * fVar175)),
                                             ZEXT416((uint)(fVar180 * fVar175)),ZEXT416(0xc0000000))
                  ;
                  auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar180 * fVar175)),
                                             ZEXT416((uint)(fVar180 * fVar180)),ZEXT416(0x40000000))
                  ;
                  fVar175 = auVar106._0_4_ * 3.0;
                  fVar176 = auVar104._0_4_ * 3.0;
                  fVar191 = fVar180 * fVar180 * 3.0;
                  auVar209._0_4_ = fVar191 * fVar154;
                  auVar209._4_4_ = fVar191 * fVar171;
                  auVar209._8_4_ = fVar191 * fVar172;
                  auVar209._12_4_ = fVar191 * fVar173;
                  auVar213 = ZEXT1664(auVar209);
                  auVar184._4_4_ = fVar176;
                  auVar184._0_4_ = fVar176;
                  auVar184._8_4_ = fVar176;
                  auVar184._12_4_ = fVar176;
                  auVar106 = vfmadd132ps_fma(auVar184,auVar209,auVar6);
                  auVar192._4_4_ = fVar175;
                  auVar192._0_4_ = fVar175;
                  auVar192._8_4_ = fVar175;
                  auVar192._12_4_ = fVar175;
                  auVar106 = vfmadd132ps_fma(auVar192,auVar106,auVar32);
                  auVar185._4_4_ = fVar174;
                  auVar185._0_4_ = fVar174;
                  auVar185._8_4_ = fVar174;
                  auVar185._12_4_ = fVar174;
                  auVar106 = vfmadd132ps_fma(auVar185,auVar106,auVar102);
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar89 * 4);
                  *(int *)(ray + k * 4 + 0x300) = auVar106._0_4_;
                  uVar13 = vextractps_avx(auVar106,1);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar13;
                  uVar13 = vextractps_avx(auVar106,2);
                  *(undefined4 *)(ray + k * 4 + 0x380) = uVar13;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar180;
                  *(undefined4 *)(ray + k * 4 + 0x400) = uVar155;
                  *(uint *)(ray + k * 4 + 0x440) = uVar11;
                  *(uint *)(ray + k * 4 + 0x480) = uVar97;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01cf64a7:
      if (8 < iVar12) {
        auVar114 = vpbroadcastd_avx512vl();
        auVar234 = ZEXT3264(auVar114);
        local_7c0._4_4_ = local_800._0_4_;
        local_7c0._0_4_ = local_800._0_4_;
        local_7c0._8_4_ = local_800._0_4_;
        local_7c0._12_4_ = local_800._0_4_;
        local_7c0._16_4_ = local_800._0_4_;
        local_7c0._20_4_ = local_800._0_4_;
        local_7c0._24_4_ = local_800._0_4_;
        local_7c0._28_4_ = local_800._0_4_;
        uStack_79c = local_7a0;
        uStack_798 = local_7a0;
        uStack_794 = local_7a0;
        uStack_790 = local_7a0;
        uStack_78c = local_7a0;
        uStack_788 = local_7a0;
        uStack_784 = local_7a0;
        local_3c0 = 1.0 / (float)local_480._0_4_;
        fStack_3bc = local_3c0;
        fStack_3b8 = local_3c0;
        fStack_3b4 = local_3c0;
        fStack_3b0 = local_3c0;
        fStack_3ac = local_3c0;
        fStack_3a8 = local_3c0;
        fStack_3a4 = local_3c0;
        auVar231 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar231);
        auVar231 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar231);
        lVar95 = 8;
LAB_01cf6559:
        auVar114 = vpbroadcastd_avx512vl();
        auVar114 = vpor_avx2(auVar114,_DAT_01fe9900);
        uVar31 = vpcmpgtd_avx512vl(auVar234._0_32_,auVar114);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar95 * 4 + lVar73);
        auVar112 = *(undefined1 (*) [32])(lVar73 + 0x21aa768 + lVar95 * 4);
        auVar123 = *(undefined1 (*) [32])(lVar73 + 0x21aabec + lVar95 * 4);
        auVar122 = *(undefined1 (*) [32])(lVar73 + 0x21ab070 + lVar95 * 4);
        auVar231._0_4_ = auVar122._0_4_ * (float)local_720._0_4_;
        auVar231._4_4_ = auVar122._4_4_ * (float)local_720._4_4_;
        auVar231._8_4_ = auVar122._8_4_ * fStack_718;
        auVar231._12_4_ = auVar122._12_4_ * fStack_714;
        auVar231._16_4_ = auVar122._16_4_ * fStack_710;
        auVar231._20_4_ = auVar122._20_4_ * fStack_70c;
        auVar231._28_36_ = auVar213._28_36_;
        auVar231._24_4_ = auVar122._24_4_ * fStack_708;
        auVar213._0_4_ = auVar122._0_4_ * (float)local_740._0_4_;
        auVar213._4_4_ = auVar122._4_4_ * (float)local_740._4_4_;
        auVar213._8_4_ = auVar122._8_4_ * fStack_738;
        auVar213._12_4_ = auVar122._12_4_ * fStack_734;
        auVar213._16_4_ = auVar122._16_4_ * fStack_730;
        auVar213._20_4_ = auVar122._20_4_ * fStack_72c;
        auVar213._28_36_ = auVar208._28_36_;
        auVar213._24_4_ = auVar122._24_4_ * fStack_728;
        auVar115 = vmulps_avx512vl(local_380,auVar122);
        auVar113 = vfmadd231ps_avx512vl(auVar231._0_32_,auVar123,local_6e0);
        auVar121 = vfmadd231ps_avx512vl(auVar213._0_32_,auVar123,local_700);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar123,local_360);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar112,local_6a0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar112,local_6c0);
        auVar116 = vfmadd231ps_avx512vl(auVar115,auVar112,local_340);
        auVar106 = vfmadd231ps_fma(auVar113,auVar114,local_660);
        auVar213 = ZEXT1664(auVar106);
        auVar104 = vfmadd231ps_fma(auVar121,auVar114,local_680);
        auVar208 = ZEXT1664(auVar104);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar95 * 4 + lVar73);
        auVar113 = *(undefined1 (*) [32])(lVar73 + 0x21acb88 + lVar95 * 4);
        auVar110 = vfmadd231ps_avx512vl(auVar116,auVar114,local_3a0);
        auVar121 = *(undefined1 (*) [32])(lVar73 + 0x21ad00c + lVar95 * 4);
        auVar116 = *(undefined1 (*) [32])(lVar73 + 0x21ad490 + lVar95 * 4);
        auVar218._0_4_ = auVar116._0_4_ * (float)local_720._0_4_;
        auVar218._4_4_ = auVar116._4_4_ * (float)local_720._4_4_;
        auVar218._8_4_ = auVar116._8_4_ * fStack_718;
        auVar218._12_4_ = auVar116._12_4_ * fStack_714;
        auVar218._16_4_ = auVar116._16_4_ * fStack_710;
        auVar218._20_4_ = auVar116._20_4_ * fStack_70c;
        auVar218._28_36_ = auVar217._28_36_;
        auVar218._24_4_ = auVar116._24_4_ * fStack_708;
        auVar56._4_4_ = auVar116._4_4_ * (float)local_740._4_4_;
        auVar56._0_4_ = auVar116._0_4_ * (float)local_740._0_4_;
        auVar56._8_4_ = auVar116._8_4_ * fStack_738;
        auVar56._12_4_ = auVar116._12_4_ * fStack_734;
        auVar56._16_4_ = auVar116._16_4_ * fStack_730;
        auVar56._20_4_ = auVar116._20_4_ * fStack_72c;
        auVar56._24_4_ = auVar116._24_4_ * fStack_728;
        auVar56._28_4_ = uStack_724;
        auVar117 = vmulps_avx512vl(local_380,auVar116);
        auVar118 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar121,local_6e0);
        auVar119 = vfmadd231ps_avx512vl(auVar56,auVar121,local_700);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar121,local_360);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar113,local_6a0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar113,local_6c0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,local_340);
        auVar103 = vfmadd231ps_fma(auVar118,auVar115,local_660);
        auVar217 = ZEXT1664(auVar103);
        auVar5 = vfmadd231ps_fma(auVar119,auVar115,local_680);
        auVar119 = vfmadd231ps_avx512vl(auVar117,auVar115,local_3a0);
        auVar120 = vmaxps_avx512vl(auVar110,auVar119);
        auVar117 = vsubps_avx(ZEXT1632(auVar103),ZEXT1632(auVar106));
        auVar118 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar104));
        auVar108 = vmulps_avx512vl(ZEXT1632(auVar104),auVar117);
        auVar109 = vmulps_avx512vl(ZEXT1632(auVar106),auVar118);
        auVar108 = vsubps_avx512vl(auVar108,auVar109);
        auVar109 = vmulps_avx512vl(auVar118,auVar118);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar117,auVar117);
        auVar120 = vmulps_avx512vl(auVar120,auVar120);
        auVar120 = vmulps_avx512vl(auVar120,auVar109);
        auVar108 = vmulps_avx512vl(auVar108,auVar108);
        uVar29 = vcmpps_avx512vl(auVar108,auVar120,2);
        bVar98 = (byte)uVar31 & (byte)uVar29;
        if (bVar98 != 0) {
          in_ZMM25 = ZEXT3264(local_520);
          auVar116 = vmulps_avx512vl(local_520,auVar116);
          auVar121 = vfmadd213ps_avx512vl(auVar121,local_500,auVar116);
          auVar113 = vfmadd213ps_avx512vl(auVar113,local_4e0,auVar121);
          local_7e0 = auVar233._0_32_;
          auVar115 = vfmadd213ps_avx512vl(auVar115,local_7e0,auVar113);
          auVar122 = vmulps_avx512vl(local_520,auVar122);
          auVar123 = vfmadd213ps_avx512vl(auVar123,local_500,auVar122);
          auVar112 = vfmadd213ps_avx512vl(auVar112,local_4e0,auVar123);
          auVar113 = vfmadd213ps_avx512vl(auVar114,local_7e0,auVar112);
          auVar114 = *(undefined1 (*) [32])(lVar73 + 0x21ab4f4 + lVar95 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar73 + 0x21ab978 + lVar95 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar73 + 0x21abdfc + lVar95 * 4);
          auVar122 = *(undefined1 (*) [32])(lVar73 + 0x21ac280 + lVar95 * 4);
          auVar121 = vmulps_avx512vl(_local_720,auVar122);
          auVar116 = vmulps_avx512vl(_local_740,auVar122);
          auVar122 = vmulps_avx512vl(local_520,auVar122);
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar123,local_6e0);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar123,local_700);
          auVar123 = vfmadd231ps_avx512vl(auVar122,local_500,auVar123);
          auVar122 = vfmadd231ps_avx512vl(auVar121,auVar112,local_6a0);
          auVar121 = vfmadd231ps_avx512vl(auVar116,auVar112,local_6c0);
          auVar112 = vfmadd231ps_avx512vl(auVar123,local_4e0,auVar112);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar114,local_660);
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar114,local_680);
          auVar116 = vfmadd231ps_avx512vl(auVar112,local_7e0,auVar114);
          auVar114 = *(undefined1 (*) [32])(lVar73 + 0x21ad914 + lVar95 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar73 + 0x21ae21c + lVar95 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar73 + 0x21ae6a0 + lVar95 * 4);
          auVar120 = vmulps_avx512vl(_local_720,auVar123);
          auVar108 = vmulps_avx512vl(_local_740,auVar123);
          auVar123 = vmulps_avx512vl(local_520,auVar123);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar112,local_6e0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_700);
          auVar123 = vfmadd231ps_avx512vl(auVar123,local_500,auVar112);
          auVar112 = *(undefined1 (*) [32])(lVar73 + 0x21add98 + lVar95 * 4);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar112,local_6a0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_6c0);
          auVar112 = vfmadd231ps_avx512vl(auVar123,local_4e0,auVar112);
          auVar123 = vfmadd231ps_avx512vl(auVar120,auVar114,local_660);
          auVar120 = vfmadd231ps_avx512vl(auVar108,auVar114,local_680);
          auVar112 = vfmadd231ps_avx512vl(auVar112,local_7e0,auVar114);
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar122,auVar108);
          vandps_avx512vl(auVar121,auVar108);
          auVar114 = vmaxps_avx(auVar108,auVar108);
          vandps_avx512vl(auVar116,auVar108);
          auVar114 = vmaxps_avx(auVar114,auVar108);
          uVar89 = vcmpps_avx512vl(auVar114,local_7c0,1);
          bVar15 = (bool)((byte)uVar89 & 1);
          auVar135._0_4_ = (float)((uint)bVar15 * auVar117._0_4_ | (uint)!bVar15 * auVar122._0_4_);
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar135._4_4_ = (float)((uint)bVar15 * auVar117._4_4_ | (uint)!bVar15 * auVar122._4_4_);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar135._8_4_ = (float)((uint)bVar15 * auVar117._8_4_ | (uint)!bVar15 * auVar122._8_4_);
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar135._12_4_ =
               (float)((uint)bVar15 * auVar117._12_4_ | (uint)!bVar15 * auVar122._12_4_);
          bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar135._16_4_ =
               (float)((uint)bVar15 * auVar117._16_4_ | (uint)!bVar15 * auVar122._16_4_);
          bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar135._20_4_ =
               (float)((uint)bVar15 * auVar117._20_4_ | (uint)!bVar15 * auVar122._20_4_);
          bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar135._24_4_ =
               (float)((uint)bVar15 * auVar117._24_4_ | (uint)!bVar15 * auVar122._24_4_);
          bVar15 = SUB81(uVar89 >> 7,0);
          auVar135._28_4_ = (uint)bVar15 * auVar117._28_4_ | (uint)!bVar15 * auVar122._28_4_;
          bVar15 = (bool)((byte)uVar89 & 1);
          auVar136._0_4_ = (float)((uint)bVar15 * auVar118._0_4_ | (uint)!bVar15 * auVar121._0_4_);
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar136._4_4_ = (float)((uint)bVar15 * auVar118._4_4_ | (uint)!bVar15 * auVar121._4_4_);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar136._8_4_ = (float)((uint)bVar15 * auVar118._8_4_ | (uint)!bVar15 * auVar121._8_4_);
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar136._12_4_ =
               (float)((uint)bVar15 * auVar118._12_4_ | (uint)!bVar15 * auVar121._12_4_);
          bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar136._16_4_ =
               (float)((uint)bVar15 * auVar118._16_4_ | (uint)!bVar15 * auVar121._16_4_);
          bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar136._20_4_ =
               (float)((uint)bVar15 * auVar118._20_4_ | (uint)!bVar15 * auVar121._20_4_);
          bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar136._24_4_ =
               (float)((uint)bVar15 * auVar118._24_4_ | (uint)!bVar15 * auVar121._24_4_);
          bVar15 = SUB81(uVar89 >> 7,0);
          auVar136._28_4_ = (uint)bVar15 * auVar118._28_4_ | (uint)!bVar15 * auVar121._28_4_;
          vandps_avx512vl(auVar123,auVar108);
          vandps_avx512vl(auVar120,auVar108);
          auVar114 = vmaxps_avx(auVar136,auVar136);
          vandps_avx512vl(auVar112,auVar108);
          auVar114 = vmaxps_avx(auVar114,auVar136);
          uVar89 = vcmpps_avx512vl(auVar114,local_7c0,1);
          bVar15 = (bool)((byte)uVar89 & 1);
          auVar137._0_4_ = (uint)bVar15 * auVar117._0_4_ | (uint)!bVar15 * auVar123._0_4_;
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar15 * auVar117._4_4_ | (uint)!bVar15 * auVar123._4_4_;
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar15 * auVar117._8_4_ | (uint)!bVar15 * auVar123._8_4_;
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar15 * auVar117._12_4_ | (uint)!bVar15 * auVar123._12_4_;
          bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar137._16_4_ = (uint)bVar15 * auVar117._16_4_ | (uint)!bVar15 * auVar123._16_4_;
          bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar137._20_4_ = (uint)bVar15 * auVar117._20_4_ | (uint)!bVar15 * auVar123._20_4_;
          bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar137._24_4_ = (uint)bVar15 * auVar117._24_4_ | (uint)!bVar15 * auVar123._24_4_;
          bVar15 = SUB81(uVar89 >> 7,0);
          auVar137._28_4_ = (uint)bVar15 * auVar117._28_4_ | (uint)!bVar15 * auVar123._28_4_;
          bVar15 = (bool)((byte)uVar89 & 1);
          auVar138._0_4_ = (float)((uint)bVar15 * auVar118._0_4_ | (uint)!bVar15 * auVar120._0_4_);
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar138._4_4_ = (float)((uint)bVar15 * auVar118._4_4_ | (uint)!bVar15 * auVar120._4_4_);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar138._8_4_ = (float)((uint)bVar15 * auVar118._8_4_ | (uint)!bVar15 * auVar120._8_4_);
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar138._12_4_ =
               (float)((uint)bVar15 * auVar118._12_4_ | (uint)!bVar15 * auVar120._12_4_);
          bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar138._16_4_ =
               (float)((uint)bVar15 * auVar118._16_4_ | (uint)!bVar15 * auVar120._16_4_);
          bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar138._20_4_ =
               (float)((uint)bVar15 * auVar118._20_4_ | (uint)!bVar15 * auVar120._20_4_);
          bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar138._24_4_ =
               (float)((uint)bVar15 * auVar118._24_4_ | (uint)!bVar15 * auVar120._24_4_);
          bVar15 = SUB81(uVar89 >> 7,0);
          auVar138._28_4_ = (uint)bVar15 * auVar118._28_4_ | (uint)!bVar15 * auVar120._28_4_;
          auVar220._8_4_ = 0x80000000;
          auVar220._0_8_ = 0x8000000080000000;
          auVar220._12_4_ = 0x80000000;
          auVar220._16_4_ = 0x80000000;
          auVar220._20_4_ = 0x80000000;
          auVar220._24_4_ = 0x80000000;
          auVar220._28_4_ = 0x80000000;
          auVar114 = vxorps_avx512vl(auVar137,auVar220);
          auVar107 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
          auVar112 = vfmadd213ps_avx512vl(auVar135,auVar135,ZEXT1632(auVar107));
          auVar7 = vfmadd231ps_fma(auVar112,auVar136,auVar136);
          auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar7));
          auVar229._8_4_ = 0xbf000000;
          auVar229._0_8_ = 0xbf000000bf000000;
          auVar229._12_4_ = 0xbf000000;
          auVar229._16_4_ = 0xbf000000;
          auVar229._20_4_ = 0xbf000000;
          auVar229._24_4_ = 0xbf000000;
          auVar229._28_4_ = 0xbf000000;
          fVar180 = auVar112._0_4_;
          fVar174 = auVar112._4_4_;
          fVar175 = auVar112._8_4_;
          fVar176 = auVar112._12_4_;
          fVar191 = auVar112._16_4_;
          fVar200 = auVar112._20_4_;
          fVar201 = auVar112._24_4_;
          auVar57._4_4_ = fVar174 * fVar174 * fVar174 * auVar7._4_4_ * -0.5;
          auVar57._0_4_ = fVar180 * fVar180 * fVar180 * auVar7._0_4_ * -0.5;
          auVar57._8_4_ = fVar175 * fVar175 * fVar175 * auVar7._8_4_ * -0.5;
          auVar57._12_4_ = fVar176 * fVar176 * fVar176 * auVar7._12_4_ * -0.5;
          auVar57._16_4_ = fVar191 * fVar191 * fVar191 * -0.0;
          auVar57._20_4_ = fVar200 * fVar200 * fVar200 * -0.0;
          auVar57._24_4_ = fVar201 * fVar201 * fVar201 * -0.0;
          auVar57._28_4_ = auVar136._28_4_;
          auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar112 = vfmadd231ps_avx512vl(auVar57,auVar123,auVar112);
          auVar58._4_4_ = auVar136._4_4_ * auVar112._4_4_;
          auVar58._0_4_ = auVar136._0_4_ * auVar112._0_4_;
          auVar58._8_4_ = auVar136._8_4_ * auVar112._8_4_;
          auVar58._12_4_ = auVar136._12_4_ * auVar112._12_4_;
          auVar58._16_4_ = auVar136._16_4_ * auVar112._16_4_;
          auVar58._20_4_ = auVar136._20_4_ * auVar112._20_4_;
          auVar58._24_4_ = auVar136._24_4_ * auVar112._24_4_;
          auVar58._28_4_ = 0;
          auVar59._4_4_ = auVar112._4_4_ * -auVar135._4_4_;
          auVar59._0_4_ = auVar112._0_4_ * -auVar135._0_4_;
          auVar59._8_4_ = auVar112._8_4_ * -auVar135._8_4_;
          auVar59._12_4_ = auVar112._12_4_ * -auVar135._12_4_;
          auVar59._16_4_ = auVar112._16_4_ * -auVar135._16_4_;
          auVar59._20_4_ = auVar112._20_4_ * -auVar135._20_4_;
          auVar59._24_4_ = auVar112._24_4_ * -auVar135._24_4_;
          auVar59._28_4_ = auVar136._28_4_;
          auVar122 = vmulps_avx512vl(auVar112,ZEXT1632(auVar107));
          auVar116 = ZEXT1632(auVar107);
          auVar112 = vfmadd213ps_avx512vl(auVar137,auVar137,auVar116);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar138,auVar138);
          auVar121 = vrsqrt14ps_avx512vl(auVar112);
          auVar112 = vmulps_avx512vl(auVar112,auVar229);
          fVar180 = auVar121._0_4_;
          fVar174 = auVar121._4_4_;
          fVar175 = auVar121._8_4_;
          fVar176 = auVar121._12_4_;
          fVar191 = auVar121._16_4_;
          fVar200 = auVar121._20_4_;
          fVar201 = auVar121._24_4_;
          auVar60._4_4_ = fVar174 * fVar174 * fVar174 * auVar112._4_4_;
          auVar60._0_4_ = fVar180 * fVar180 * fVar180 * auVar112._0_4_;
          auVar60._8_4_ = fVar175 * fVar175 * fVar175 * auVar112._8_4_;
          auVar60._12_4_ = fVar176 * fVar176 * fVar176 * auVar112._12_4_;
          auVar60._16_4_ = fVar191 * fVar191 * fVar191 * auVar112._16_4_;
          auVar60._20_4_ = fVar200 * fVar200 * fVar200 * auVar112._20_4_;
          auVar60._24_4_ = fVar201 * fVar201 * fVar201 * auVar112._24_4_;
          auVar60._28_4_ = auVar112._28_4_;
          auVar112 = vfmadd231ps_avx512vl(auVar60,auVar123,auVar121);
          auVar61._4_4_ = auVar138._4_4_ * auVar112._4_4_;
          auVar61._0_4_ = auVar138._0_4_ * auVar112._0_4_;
          auVar61._8_4_ = auVar138._8_4_ * auVar112._8_4_;
          auVar61._12_4_ = auVar138._12_4_ * auVar112._12_4_;
          auVar61._16_4_ = auVar138._16_4_ * auVar112._16_4_;
          auVar61._20_4_ = auVar138._20_4_ * auVar112._20_4_;
          auVar61._24_4_ = auVar138._24_4_ * auVar112._24_4_;
          auVar61._28_4_ = auVar121._28_4_;
          auVar62._4_4_ = auVar112._4_4_ * auVar114._4_4_;
          auVar62._0_4_ = auVar112._0_4_ * auVar114._0_4_;
          auVar62._8_4_ = auVar112._8_4_ * auVar114._8_4_;
          auVar62._12_4_ = auVar112._12_4_ * auVar114._12_4_;
          auVar62._16_4_ = auVar112._16_4_ * auVar114._16_4_;
          auVar62._20_4_ = auVar112._20_4_ * auVar114._20_4_;
          auVar62._24_4_ = auVar112._24_4_ * auVar114._24_4_;
          auVar62._28_4_ = auVar114._28_4_;
          auVar114 = vmulps_avx512vl(auVar112,auVar116);
          auVar7 = vfmadd213ps_fma(auVar58,auVar110,ZEXT1632(auVar106));
          auVar8 = vfmadd213ps_fma(auVar59,auVar110,ZEXT1632(auVar104));
          auVar123 = vfmadd213ps_avx512vl(auVar122,auVar110,auVar113);
          auVar121 = vfmadd213ps_avx512vl(auVar61,auVar119,ZEXT1632(auVar103));
          auVar177 = vfnmadd213ps_fma(auVar58,auVar110,ZEXT1632(auVar106));
          auVar106 = vfmadd213ps_fma(auVar62,auVar119,ZEXT1632(auVar5));
          auVar181 = vfnmadd213ps_fma(auVar59,auVar110,ZEXT1632(auVar104));
          auVar104 = vfmadd213ps_fma(auVar114,auVar119,auVar115);
          auVar105 = vfnmadd231ps_fma(auVar113,auVar110,auVar122);
          auVar182 = vfnmadd213ps_fma(auVar61,auVar119,ZEXT1632(auVar103));
          auVar183 = vfnmadd213ps_fma(auVar62,auVar119,ZEXT1632(auVar5));
          auVar221 = vfnmadd231ps_fma(auVar115,auVar119,auVar114);
          auVar115 = vsubps_avx512vl(auVar121,ZEXT1632(auVar177));
          auVar114 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar181));
          auVar112 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar105));
          auVar63._4_4_ = auVar114._4_4_ * auVar105._4_4_;
          auVar63._0_4_ = auVar114._0_4_ * auVar105._0_4_;
          auVar63._8_4_ = auVar114._8_4_ * auVar105._8_4_;
          auVar63._12_4_ = auVar114._12_4_ * auVar105._12_4_;
          auVar63._16_4_ = auVar114._16_4_ * 0.0;
          auVar63._20_4_ = auVar114._20_4_ * 0.0;
          auVar63._24_4_ = auVar114._24_4_ * 0.0;
          auVar63._28_4_ = auVar122._28_4_;
          auVar103 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar181),auVar112);
          auVar64._4_4_ = auVar112._4_4_ * auVar177._4_4_;
          auVar64._0_4_ = auVar112._0_4_ * auVar177._0_4_;
          auVar64._8_4_ = auVar112._8_4_ * auVar177._8_4_;
          auVar64._12_4_ = auVar112._12_4_ * auVar177._12_4_;
          auVar64._16_4_ = auVar112._16_4_ * 0.0;
          auVar64._20_4_ = auVar112._20_4_ * 0.0;
          auVar64._24_4_ = auVar112._24_4_ * 0.0;
          auVar64._28_4_ = auVar112._28_4_;
          auVar5 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar105),auVar115);
          auVar65._4_4_ = auVar181._4_4_ * auVar115._4_4_;
          auVar65._0_4_ = auVar181._0_4_ * auVar115._0_4_;
          auVar65._8_4_ = auVar181._8_4_ * auVar115._8_4_;
          auVar65._12_4_ = auVar181._12_4_ * auVar115._12_4_;
          auVar65._16_4_ = auVar115._16_4_ * 0.0;
          auVar65._20_4_ = auVar115._20_4_ * 0.0;
          auVar65._24_4_ = auVar115._24_4_ * 0.0;
          auVar65._28_4_ = auVar115._28_4_;
          auVar9 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar177),auVar114);
          auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar116,ZEXT1632(auVar5));
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,ZEXT1632(auVar103));
          auVar108 = ZEXT1632(auVar107);
          uVar89 = vcmpps_avx512vl(auVar114,auVar108,2);
          bVar88 = (byte)uVar89;
          fVar100 = (float)((uint)(bVar88 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar88 & 1) * auVar182._0_4_);
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          fVar148 = (float)((uint)bVar15 * auVar7._4_4_ | (uint)!bVar15 * auVar182._4_4_);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          fVar150 = (float)((uint)bVar15 * auVar7._8_4_ | (uint)!bVar15 * auVar182._8_4_);
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          fVar152 = (float)((uint)bVar15 * auVar7._12_4_ | (uint)!bVar15 * auVar182._12_4_);
          auVar116 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar100))));
          fVar101 = (float)((uint)(bVar88 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar88 & 1) * auVar183._0_4_);
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          fVar149 = (float)((uint)bVar15 * auVar8._4_4_ | (uint)!bVar15 * auVar183._4_4_);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          fVar151 = (float)((uint)bVar15 * auVar8._8_4_ | (uint)!bVar15 * auVar183._8_4_);
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          fVar153 = (float)((uint)bVar15 * auVar8._12_4_ | (uint)!bVar15 * auVar183._12_4_);
          auVar117 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar149,fVar101))));
          auVar139._0_4_ =
               (float)((uint)(bVar88 & 1) * auVar123._0_4_ |
                      (uint)!(bool)(bVar88 & 1) * auVar221._0_4_);
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar15 * auVar123._4_4_ | (uint)!bVar15 * auVar221._4_4_);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar15 * auVar123._8_4_ | (uint)!bVar15 * auVar221._8_4_);
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar139._12_4_ =
               (float)((uint)bVar15 * auVar123._12_4_ | (uint)!bVar15 * auVar221._12_4_);
          fVar180 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar123._16_4_);
          auVar139._16_4_ = fVar180;
          fVar174 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar123._20_4_);
          auVar139._20_4_ = fVar174;
          fVar175 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar123._24_4_);
          auVar139._24_4_ = fVar175;
          iVar1 = (uint)(byte)(uVar89 >> 7) * auVar123._28_4_;
          auVar139._28_4_ = iVar1;
          auVar114 = vblendmps_avx512vl(ZEXT1632(auVar177),auVar121);
          auVar140._0_4_ =
               (uint)(bVar88 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar103._0_4_;
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar140._4_4_ = (uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * auVar103._4_4_;
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar140._8_4_ = (uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * auVar103._8_4_;
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar140._12_4_ = (uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * auVar103._12_4_;
          auVar140._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar114._16_4_;
          auVar140._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar114._20_4_;
          auVar140._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar114._24_4_;
          auVar140._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar114._28_4_;
          auVar114 = vblendmps_avx512vl(ZEXT1632(auVar181),ZEXT1632(auVar106));
          auVar141._0_4_ =
               (float)((uint)(bVar88 & 1) * auVar114._0_4_ |
                      (uint)!(bool)(bVar88 & 1) * auVar7._0_4_);
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar141._4_4_ = (float)((uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * auVar7._4_4_);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar141._8_4_ = (float)((uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * auVar7._8_4_);
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar141._12_4_ = (float)((uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * auVar7._12_4_);
          fVar200 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar114._16_4_);
          auVar141._16_4_ = fVar200;
          fVar176 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar114._20_4_);
          auVar141._20_4_ = fVar176;
          fVar191 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar114._24_4_);
          auVar141._24_4_ = fVar191;
          auVar141._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar114._28_4_;
          auVar114 = vblendmps_avx512vl(ZEXT1632(auVar105),ZEXT1632(auVar104));
          auVar142._0_4_ =
               (float)((uint)(bVar88 & 1) * auVar114._0_4_ |
                      (uint)!(bool)(bVar88 & 1) * auVar8._0_4_);
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar142._4_4_ = (float)((uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * auVar8._4_4_);
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar142._8_4_ = (float)((uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * auVar8._8_4_);
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar142._12_4_ = (float)((uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * auVar8._12_4_);
          fVar201 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar114._16_4_);
          auVar142._16_4_ = fVar201;
          fVar202 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar114._20_4_);
          auVar142._20_4_ = fVar202;
          fVar203 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar114._24_4_);
          auVar142._24_4_ = fVar203;
          iVar2 = (uint)(byte)(uVar89 >> 7) * auVar114._28_4_;
          auVar142._28_4_ = iVar2;
          auVar143._0_4_ =
               (uint)(bVar88 & 1) * (int)auVar177._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar121._0_4_
          ;
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar143._4_4_ = (uint)bVar15 * (int)auVar177._4_4_ | (uint)!bVar15 * auVar121._4_4_;
          bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar143._8_4_ = (uint)bVar15 * (int)auVar177._8_4_ | (uint)!bVar15 * auVar121._8_4_;
          bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar143._12_4_ = (uint)bVar15 * (int)auVar177._12_4_ | (uint)!bVar15 * auVar121._12_4_;
          auVar143._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar121._16_4_;
          auVar143._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar121._20_4_;
          auVar143._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar121._24_4_;
          auVar143._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar121._28_4_;
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar121 = vsubps_avx512vl(auVar143,auVar116);
          auVar112 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar181._12_4_ |
                                                   (uint)!bVar19 * auVar106._12_4_,
                                                   CONCAT48((uint)bVar17 * (int)auVar181._8_4_ |
                                                            (uint)!bVar17 * auVar106._8_4_,
                                                            CONCAT44((uint)bVar15 *
                                                                     (int)auVar181._4_4_ |
                                                                     (uint)!bVar15 * auVar106._4_4_,
                                                                     (uint)(bVar88 & 1) *
                                                                     (int)auVar181._0_4_ |
                                                                     (uint)!(bool)(bVar88 & 1) *
                                                                     auVar106._0_4_)))),auVar117);
          auVar213 = ZEXT3264(auVar112);
          auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar105._12_4_ |
                                                   (uint)!bVar20 * auVar104._12_4_,
                                                   CONCAT48((uint)bVar18 * (int)auVar105._8_4_ |
                                                            (uint)!bVar18 * auVar104._8_4_,
                                                            CONCAT44((uint)bVar16 *
                                                                     (int)auVar105._4_4_ |
                                                                     (uint)!bVar16 * auVar104._4_4_,
                                                                     (uint)(bVar88 & 1) *
                                                                     (int)auVar105._0_4_ |
                                                                     (uint)!(bool)(bVar88 & 1) *
                                                                     auVar104._0_4_)))),auVar139);
          auVar122 = vsubps_avx(auVar116,auVar140);
          auVar217 = ZEXT3264(auVar122);
          auVar115 = vsubps_avx(auVar117,auVar141);
          auVar113 = vsubps_avx(auVar139,auVar142);
          auVar66._4_4_ = auVar123._4_4_ * fVar148;
          auVar66._0_4_ = auVar123._0_4_ * fVar100;
          auVar66._8_4_ = auVar123._8_4_ * fVar150;
          auVar66._12_4_ = auVar123._12_4_ * fVar152;
          auVar66._16_4_ = auVar123._16_4_ * 0.0;
          auVar66._20_4_ = auVar123._20_4_ * 0.0;
          auVar66._24_4_ = auVar123._24_4_ * 0.0;
          auVar66._28_4_ = 0;
          auVar106 = vfmsub231ps_fma(auVar66,auVar139,auVar121);
          auVar198._0_4_ = fVar101 * auVar121._0_4_;
          auVar198._4_4_ = fVar149 * auVar121._4_4_;
          auVar198._8_4_ = fVar151 * auVar121._8_4_;
          auVar198._12_4_ = fVar153 * auVar121._12_4_;
          auVar198._16_4_ = auVar121._16_4_ * 0.0;
          auVar198._20_4_ = auVar121._20_4_ * 0.0;
          auVar198._24_4_ = auVar121._24_4_ * 0.0;
          auVar198._28_4_ = 0;
          auVar104 = vfmsub231ps_fma(auVar198,auVar116,auVar112);
          auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar108,ZEXT1632(auVar106));
          auVar206._0_4_ = auVar112._0_4_ * auVar139._0_4_;
          auVar206._4_4_ = auVar112._4_4_ * auVar139._4_4_;
          auVar206._8_4_ = auVar112._8_4_ * auVar139._8_4_;
          auVar206._12_4_ = auVar112._12_4_ * auVar139._12_4_;
          auVar206._16_4_ = auVar112._16_4_ * fVar180;
          auVar206._20_4_ = auVar112._20_4_ * fVar174;
          auVar206._24_4_ = auVar112._24_4_ * fVar175;
          auVar206._28_4_ = 0;
          auVar106 = vfmsub231ps_fma(auVar206,auVar117,auVar123);
          auVar118 = vfmadd231ps_avx512vl(auVar114,auVar108,ZEXT1632(auVar106));
          auVar114 = vmulps_avx512vl(auVar113,auVar140);
          auVar114 = vfmsub231ps_avx512vl(auVar114,auVar122,auVar142);
          auVar67._4_4_ = auVar115._4_4_ * auVar142._4_4_;
          auVar67._0_4_ = auVar115._0_4_ * auVar142._0_4_;
          auVar67._8_4_ = auVar115._8_4_ * auVar142._8_4_;
          auVar67._12_4_ = auVar115._12_4_ * auVar142._12_4_;
          auVar67._16_4_ = auVar115._16_4_ * fVar201;
          auVar67._20_4_ = auVar115._20_4_ * fVar202;
          auVar67._24_4_ = auVar115._24_4_ * fVar203;
          auVar67._28_4_ = iVar2;
          auVar106 = vfmsub231ps_fma(auVar67,auVar141,auVar113);
          auVar207._0_4_ = auVar141._0_4_ * auVar122._0_4_;
          auVar207._4_4_ = auVar141._4_4_ * auVar122._4_4_;
          auVar207._8_4_ = auVar141._8_4_ * auVar122._8_4_;
          auVar207._12_4_ = auVar141._12_4_ * auVar122._12_4_;
          auVar207._16_4_ = fVar200 * auVar122._16_4_;
          auVar207._20_4_ = fVar176 * auVar122._20_4_;
          auVar207._24_4_ = fVar191 * auVar122._24_4_;
          auVar207._28_4_ = 0;
          auVar104 = vfmsub231ps_fma(auVar207,auVar115,auVar140);
          auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar108,auVar114);
          auVar120 = vfmadd231ps_avx512vl(auVar114,auVar108,ZEXT1632(auVar106));
          auVar208 = ZEXT3264(auVar120);
          auVar114 = vmaxps_avx(auVar118,auVar120);
          uVar29 = vcmpps_avx512vl(auVar114,auVar108,2);
          bVar98 = bVar98 & (byte)uVar29;
          if (bVar98 != 0) {
            uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar230._4_4_ = uVar155;
            auVar230._0_4_ = uVar155;
            auVar230._8_4_ = uVar155;
            auVar230._12_4_ = uVar155;
            auVar230._16_4_ = uVar155;
            auVar230._20_4_ = uVar155;
            auVar230._24_4_ = uVar155;
            auVar230._28_4_ = uVar155;
            auVar231 = ZEXT3264(auVar230);
            auVar68._4_4_ = auVar113._4_4_ * auVar112._4_4_;
            auVar68._0_4_ = auVar113._0_4_ * auVar112._0_4_;
            auVar68._8_4_ = auVar113._8_4_ * auVar112._8_4_;
            auVar68._12_4_ = auVar113._12_4_ * auVar112._12_4_;
            auVar68._16_4_ = auVar113._16_4_ * auVar112._16_4_;
            auVar68._20_4_ = auVar113._20_4_ * auVar112._20_4_;
            auVar68._24_4_ = auVar113._24_4_ * auVar112._24_4_;
            auVar68._28_4_ = auVar114._28_4_;
            auVar5 = vfmsub231ps_fma(auVar68,auVar115,auVar123);
            auVar69._4_4_ = auVar123._4_4_ * auVar122._4_4_;
            auVar69._0_4_ = auVar123._0_4_ * auVar122._0_4_;
            auVar69._8_4_ = auVar123._8_4_ * auVar122._8_4_;
            auVar69._12_4_ = auVar123._12_4_ * auVar122._12_4_;
            auVar69._16_4_ = auVar123._16_4_ * auVar122._16_4_;
            auVar69._20_4_ = auVar123._20_4_ * auVar122._20_4_;
            auVar69._24_4_ = auVar123._24_4_ * auVar122._24_4_;
            auVar69._28_4_ = auVar123._28_4_;
            auVar103 = vfmsub231ps_fma(auVar69,auVar121,auVar113);
            auVar70._4_4_ = auVar115._4_4_ * auVar121._4_4_;
            auVar70._0_4_ = auVar115._0_4_ * auVar121._0_4_;
            auVar70._8_4_ = auVar115._8_4_ * auVar121._8_4_;
            auVar70._12_4_ = auVar115._12_4_ * auVar121._12_4_;
            auVar70._16_4_ = auVar115._16_4_ * auVar121._16_4_;
            auVar70._20_4_ = auVar115._20_4_ * auVar121._20_4_;
            auVar70._24_4_ = auVar115._24_4_ * auVar121._24_4_;
            auVar70._28_4_ = auVar115._28_4_;
            auVar7 = vfmsub231ps_fma(auVar70,auVar122,auVar112);
            auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar7));
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar5),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar114 = vrcp14ps_avx512vl(ZEXT1632(auVar104));
            auVar37._8_4_ = 0x3f800000;
            auVar37._0_8_ = 0x3f8000003f800000;
            auVar37._12_4_ = 0x3f800000;
            auVar37._16_4_ = 0x3f800000;
            auVar37._20_4_ = 0x3f800000;
            auVar37._24_4_ = 0x3f800000;
            auVar37._28_4_ = 0x3f800000;
            auVar112 = vfnmadd213ps_avx512vl(auVar114,ZEXT1632(auVar104),auVar37);
            auVar106 = vfmadd132ps_fma(auVar112,auVar114,auVar114);
            auVar213 = ZEXT1664(auVar106);
            auVar71._4_4_ = auVar7._4_4_ * auVar139._4_4_;
            auVar71._0_4_ = auVar7._0_4_ * auVar139._0_4_;
            auVar71._8_4_ = auVar7._8_4_ * auVar139._8_4_;
            auVar71._12_4_ = auVar7._12_4_ * auVar139._12_4_;
            auVar71._16_4_ = fVar180 * 0.0;
            auVar71._20_4_ = fVar174 * 0.0;
            auVar71._24_4_ = fVar175 * 0.0;
            auVar71._28_4_ = iVar1;
            auVar103 = vfmadd231ps_fma(auVar71,auVar117,ZEXT1632(auVar103));
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar116,ZEXT1632(auVar5));
            fVar180 = auVar106._0_4_;
            fVar174 = auVar106._4_4_;
            fVar175 = auVar106._8_4_;
            fVar176 = auVar106._12_4_;
            local_600._28_4_ = auVar114._28_4_;
            local_600._0_28_ =
                 ZEXT1628(CONCAT412(auVar103._12_4_ * fVar176,
                                    CONCAT48(auVar103._8_4_ * fVar175,
                                             CONCAT44(auVar103._4_4_ * fVar174,
                                                      auVar103._0_4_ * fVar180))));
            auVar217 = ZEXT3264(local_600);
            uVar29 = vcmpps_avx512vl(local_600,auVar230,2);
            auVar87._4_4_ = uStack_79c;
            auVar87._0_4_ = local_7a0;
            auVar87._8_4_ = uStack_798;
            auVar87._12_4_ = uStack_794;
            auVar87._16_4_ = uStack_790;
            auVar87._20_4_ = uStack_78c;
            auVar87._24_4_ = uStack_788;
            auVar87._28_4_ = uStack_784;
            uVar31 = vcmpps_avx512vl(local_600,auVar87,0xd);
            bVar98 = (byte)uVar29 & (byte)uVar31 & bVar98;
            if (bVar98 != 0) {
              uVar99 = vcmpps_avx512vl(ZEXT1632(auVar104),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar99 = bVar98 & uVar99;
              if ((char)uVar99 != '\0') {
                fVar191 = auVar118._0_4_ * fVar180;
                fVar200 = auVar118._4_4_ * fVar174;
                auVar72._4_4_ = fVar200;
                auVar72._0_4_ = fVar191;
                fVar201 = auVar118._8_4_ * fVar175;
                auVar72._8_4_ = fVar201;
                fVar202 = auVar118._12_4_ * fVar176;
                auVar72._12_4_ = fVar202;
                fVar203 = auVar118._16_4_ * 0.0;
                auVar72._16_4_ = fVar203;
                fVar100 = auVar118._20_4_ * 0.0;
                auVar72._20_4_ = fVar100;
                fVar101 = auVar118._24_4_ * 0.0;
                auVar72._24_4_ = fVar101;
                auVar72._28_4_ = auVar118._28_4_;
                auVar190._8_4_ = 0x3f800000;
                auVar190._0_8_ = 0x3f8000003f800000;
                auVar190._12_4_ = 0x3f800000;
                auVar190._16_4_ = 0x3f800000;
                auVar190._20_4_ = 0x3f800000;
                auVar190._24_4_ = 0x3f800000;
                auVar190._28_4_ = 0x3f800000;
                auVar114 = vsubps_avx(auVar190,auVar72);
                local_640._0_4_ =
                     (float)((uint)(bVar88 & 1) * (int)fVar191 |
                            (uint)!(bool)(bVar88 & 1) * auVar114._0_4_);
                bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
                local_640._4_4_ =
                     (float)((uint)bVar15 * (int)fVar200 | (uint)!bVar15 * auVar114._4_4_);
                bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
                local_640._8_4_ =
                     (float)((uint)bVar15 * (int)fVar201 | (uint)!bVar15 * auVar114._8_4_);
                bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
                local_640._12_4_ =
                     (float)((uint)bVar15 * (int)fVar202 | (uint)!bVar15 * auVar114._12_4_);
                bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                local_640._16_4_ =
                     (float)((uint)bVar15 * (int)fVar203 | (uint)!bVar15 * auVar114._16_4_);
                bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                local_640._20_4_ =
                     (float)((uint)bVar15 * (int)fVar100 | (uint)!bVar15 * auVar114._20_4_);
                bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
                local_640._24_4_ =
                     (float)((uint)bVar15 * (int)fVar101 | (uint)!bVar15 * auVar114._24_4_);
                bVar15 = SUB81(uVar89 >> 7,0);
                local_640._28_4_ =
                     (float)((uint)bVar15 * auVar118._28_4_ | (uint)!bVar15 * auVar114._28_4_);
                auVar114 = vsubps_avx(auVar119,auVar110);
                auVar106 = vfmadd213ps_fma(auVar114,local_640,auVar110);
                uVar155 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar38._4_4_ = uVar155;
                auVar38._0_4_ = uVar155;
                auVar38._8_4_ = uVar155;
                auVar38._12_4_ = uVar155;
                auVar38._16_4_ = uVar155;
                auVar38._20_4_ = uVar155;
                auVar38._24_4_ = uVar155;
                auVar38._28_4_ = uVar155;
                auVar114 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar106._12_4_ + auVar106._12_4_,
                                                              CONCAT48(auVar106._8_4_ +
                                                                       auVar106._8_4_,
                                                                       CONCAT44(auVar106._4_4_ +
                                                                                auVar106._4_4_,
                                                                                auVar106._0_4_ +
                                                                                auVar106._0_4_)))),
                                           auVar38);
                uVar30 = vcmpps_avx512vl(local_600,auVar114,6);
                uVar99 = uVar99 & uVar30;
                bVar98 = (byte)uVar99;
                if (bVar98 != 0) {
                  auVar179._0_4_ = auVar120._0_4_ * fVar180;
                  auVar179._4_4_ = auVar120._4_4_ * fVar174;
                  auVar179._8_4_ = auVar120._8_4_ * fVar175;
                  auVar179._12_4_ = auVar120._12_4_ * fVar176;
                  auVar179._16_4_ = auVar120._16_4_ * 0.0;
                  auVar179._20_4_ = auVar120._20_4_ * 0.0;
                  auVar179._24_4_ = auVar120._24_4_ * 0.0;
                  auVar179._28_4_ = 0;
                  auVar199._8_4_ = 0x3f800000;
                  auVar199._0_8_ = 0x3f8000003f800000;
                  auVar199._12_4_ = 0x3f800000;
                  auVar199._16_4_ = 0x3f800000;
                  auVar199._20_4_ = 0x3f800000;
                  auVar199._24_4_ = 0x3f800000;
                  auVar199._28_4_ = 0x3f800000;
                  auVar114 = vsubps_avx(auVar199,auVar179);
                  auVar144._0_4_ =
                       (uint)(bVar88 & 1) * (int)auVar179._0_4_ |
                       (uint)!(bool)(bVar88 & 1) * auVar114._0_4_;
                  bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
                  auVar144._4_4_ =
                       (uint)bVar15 * (int)auVar179._4_4_ | (uint)!bVar15 * auVar114._4_4_;
                  bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
                  auVar144._8_4_ =
                       (uint)bVar15 * (int)auVar179._8_4_ | (uint)!bVar15 * auVar114._8_4_;
                  bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
                  auVar144._12_4_ =
                       (uint)bVar15 * (int)auVar179._12_4_ | (uint)!bVar15 * auVar114._12_4_;
                  bVar15 = (bool)((byte)(uVar89 >> 4) & 1);
                  auVar144._16_4_ =
                       (uint)bVar15 * (int)auVar179._16_4_ | (uint)!bVar15 * auVar114._16_4_;
                  bVar15 = (bool)((byte)(uVar89 >> 5) & 1);
                  auVar144._20_4_ =
                       (uint)bVar15 * (int)auVar179._20_4_ | (uint)!bVar15 * auVar114._20_4_;
                  bVar15 = (bool)((byte)(uVar89 >> 6) & 1);
                  auVar144._24_4_ =
                       (uint)bVar15 * (int)auVar179._24_4_ | (uint)!bVar15 * auVar114._24_4_;
                  auVar144._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar114._28_4_;
                  auVar39._8_4_ = 0x40000000;
                  auVar39._0_8_ = 0x4000000040000000;
                  auVar39._12_4_ = 0x40000000;
                  auVar39._16_4_ = 0x40000000;
                  auVar39._20_4_ = 0x40000000;
                  auVar39._24_4_ = 0x40000000;
                  auVar39._28_4_ = 0x40000000;
                  local_620 = vfmsub132ps_avx512vl(auVar144,auVar199,auVar39);
                  local_5e0 = (undefined4)lVar95;
                  local_5d0 = local_880;
                  uStack_5c8 = uStack_878;
                  local_5c0 = local_870;
                  uStack_5b8 = uStack_868;
                  local_5b0 = local_8a0;
                  uStack_5a8 = uStack_898;
                  local_5a0 = local_890;
                  uStack_598 = uStack_888;
                  pGVar96 = (context->scene->geometries).items[uVar97].ptr;
                  if ((pGVar96->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar106 = vcvtsi2ss_avx512f(auVar107,local_5e0);
                    fVar180 = auVar106._0_4_;
                    local_580[0] = (fVar180 + local_640._0_4_ + 0.0) * local_3c0;
                    local_580[1] = (fVar180 + local_640._4_4_ + 1.0) * fStack_3bc;
                    local_580[2] = (fVar180 + local_640._8_4_ + 2.0) * fStack_3b8;
                    local_580[3] = (fVar180 + local_640._12_4_ + 3.0) * fStack_3b4;
                    fStack_570 = (fVar180 + local_640._16_4_ + 4.0) * fStack_3b0;
                    fStack_56c = (fVar180 + local_640._20_4_ + 5.0) * fStack_3ac;
                    fStack_568 = (fVar180 + local_640._24_4_ + 6.0) * fStack_3a8;
                    fStack_564 = fVar180 + local_640._28_4_ + 7.0;
                    local_560 = local_620;
                    local_540 = local_600;
                    auVar165._8_4_ = 0x7f800000;
                    auVar165._0_8_ = 0x7f8000007f800000;
                    auVar165._12_4_ = 0x7f800000;
                    auVar165._16_4_ = 0x7f800000;
                    auVar165._20_4_ = 0x7f800000;
                    auVar165._24_4_ = 0x7f800000;
                    auVar165._28_4_ = 0x7f800000;
                    auVar114 = vblendmps_avx512vl(auVar165,local_600);
                    auVar145._0_4_ =
                         (uint)(bVar98 & 1) * auVar114._0_4_ |
                         (uint)!(bool)(bVar98 & 1) * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar99 >> 1) & 1);
                    auVar145._4_4_ = (uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar99 >> 2) & 1);
                    auVar145._8_4_ = (uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar99 >> 3) & 1);
                    auVar145._12_4_ = (uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar99 >> 4) & 1);
                    auVar145._16_4_ = (uint)bVar15 * auVar114._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar99 >> 5) & 1);
                    auVar145._20_4_ = (uint)bVar15 * auVar114._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar99 >> 6) & 1);
                    auVar145._24_4_ = (uint)bVar15 * auVar114._24_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = SUB81(uVar99 >> 7,0);
                    auVar145._28_4_ = (uint)bVar15 * auVar114._28_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar114 = vshufps_avx(auVar145,auVar145,0xb1);
                    auVar114 = vminps_avx(auVar145,auVar114);
                    auVar112 = vshufpd_avx(auVar114,auVar114,5);
                    auVar114 = vminps_avx(auVar114,auVar112);
                    auVar112 = vpermpd_avx2(auVar114,0x4e);
                    auVar114 = vminps_avx(auVar114,auVar112);
                    uVar29 = vcmpps_avx512vl(auVar145,auVar114,0);
                    uVar91 = (uint)uVar99;
                    if (((byte)uVar29 & bVar98) != 0) {
                      uVar91 = (uint)((byte)uVar29 & bVar98);
                    }
                    uVar92 = 0;
                    for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                      uVar92 = uVar92 + 1;
                    }
                    uVar89 = (ulong)uVar92;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_3e0 = vmovdqa64_avx512vl(auVar234._0_32_);
                      local_4c0._0_32_ = local_600;
                      local_820._0_8_ = pGVar96;
                      local_5dc = iVar12;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[uVar89]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + uVar89 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_540 + uVar89 * 4);
                        local_858.context = context->user;
                        fVar176 = local_200._0_4_;
                        fVar174 = 1.0 - fVar176;
                        fVar180 = fVar174 * fVar174 * -3.0;
                        auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),
                                                   ZEXT416((uint)(fVar176 * fVar174)),
                                                   ZEXT416(0xc0000000));
                        auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar176 * fVar174)),
                                                   ZEXT416((uint)(fVar176 * fVar176)),
                                                   ZEXT416(0x40000000));
                        fVar174 = auVar106._0_4_ * 3.0;
                        fVar175 = auVar104._0_4_ * 3.0;
                        fVar176 = fVar176 * fVar176 * 3.0;
                        auVar211._0_4_ = fVar176 * fVar154;
                        auVar211._4_4_ = fVar176 * fVar171;
                        auVar211._8_4_ = fVar176 * fVar172;
                        auVar211._12_4_ = fVar176 * fVar173;
                        auVar156._4_4_ = fVar175;
                        auVar156._0_4_ = fVar175;
                        auVar156._8_4_ = fVar175;
                        auVar156._12_4_ = fVar175;
                        auVar106 = vfmadd132ps_fma(auVar156,auVar211,auVar6);
                        auVar194._4_4_ = fVar174;
                        auVar194._0_4_ = fVar174;
                        auVar194._8_4_ = fVar174;
                        auVar194._12_4_ = fVar174;
                        auVar106 = vfmadd132ps_fma(auVar194,auVar106,auVar32);
                        auVar157._4_4_ = fVar180;
                        auVar157._0_4_ = fVar180;
                        auVar157._8_4_ = fVar180;
                        auVar157._12_4_ = fVar180;
                        auVar106 = vfmadd132ps_fma(auVar157,auVar106,auVar102);
                        auVar232 = vbroadcastss_avx512f(auVar106);
                        auVar170 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar208 = vpermps_avx512f(auVar170,ZEXT1664(auVar106));
                        auVar213 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar213,ZEXT1664(auVar106));
                        local_2c0[0] = (RTCHitN)auVar232[0];
                        local_2c0[1] = (RTCHitN)auVar232[1];
                        local_2c0[2] = (RTCHitN)auVar232[2];
                        local_2c0[3] = (RTCHitN)auVar232[3];
                        local_2c0[4] = (RTCHitN)auVar232[4];
                        local_2c0[5] = (RTCHitN)auVar232[5];
                        local_2c0[6] = (RTCHitN)auVar232[6];
                        local_2c0[7] = (RTCHitN)auVar232[7];
                        local_2c0[8] = (RTCHitN)auVar232[8];
                        local_2c0[9] = (RTCHitN)auVar232[9];
                        local_2c0[10] = (RTCHitN)auVar232[10];
                        local_2c0[0xb] = (RTCHitN)auVar232[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar232[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar232[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar232[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar232[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar232[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar232[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar232[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar232[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar232[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar232[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar232[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar232[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar232[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar232[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar232[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar232[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar232[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar232[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar232[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar232[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar232[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar232[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar232[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar232[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar232[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar232[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar232[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar232[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar232[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar232[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar232[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar232[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar232[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar232[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar232[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar232[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar232[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar232[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar232[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar232[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar232[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar232[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar232[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar232[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar232[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar232[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar232[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar232[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar232[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar232[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar232[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar232[0x3f];
                        local_280 = auVar208;
                        local_180 = local_440._0_8_;
                        uStack_178 = local_440._8_8_;
                        uStack_170 = local_440._16_8_;
                        uStack_168 = local_440._24_8_;
                        uStack_160 = local_440._32_8_;
                        uStack_158 = local_440._40_8_;
                        uStack_150 = local_440._48_8_;
                        uStack_148 = local_440._56_8_;
                        auVar232 = vmovdqa64_avx512f(local_480);
                        local_140 = vmovdqa64_avx512f(auVar232);
                        auVar114 = vpcmpeqd_avx2(auVar232._0_32_,auVar232._0_32_);
                        local_828[3] = auVar114;
                        local_828[2] = auVar114;
                        local_828[1] = auVar114;
                        *local_828 = auVar114;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_858.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_858.context)->instPrimID[0]))
                        ;
                        auVar232 = vmovdqa64_avx512f(local_300);
                        local_780 = vmovdqa64_avx512f(auVar232);
                        local_858.valid = (int *)local_780;
                        local_858.geometryUserPtr = pGVar96->userPtr;
                        local_858.hit = local_2c0;
                        local_858.N = 0x10;
                        local_800 = auVar231._0_32_;
                        local_858.ray = (RTCRayN *)ray;
                        if (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar208 = ZEXT1664(auVar208._0_16_);
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          (*pGVar96->intersectionFilterN)(&local_858);
                          auVar217 = ZEXT3264(local_4c0._0_32_);
                          auVar231 = ZEXT3264(local_800);
                          auVar232 = vmovdqa64_avx512f(local_780);
                          pGVar96 = (Geometry *)local_820._0_8_;
                        }
                        uVar29 = vptestmd_avx512f(auVar232,auVar232);
                        if ((short)uVar29 == 0) {
LAB_01cf7144:
                          *(int *)(ray + k * 4 + 0x200) = auVar231._0_4_;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar96->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar208 = ZEXT1664(auVar208._0_16_);
                            auVar213 = ZEXT1664(auVar213._0_16_);
                            (*p_Var14)(&local_858);
                            auVar217 = ZEXT3264(local_4c0._0_32_);
                            auVar231 = ZEXT3264(local_800);
                            auVar232 = vmovdqa64_avx512f(local_780);
                            pGVar96 = (Geometry *)local_820._0_8_;
                          }
                          uVar30 = vptestmd_avx512f(auVar232,auVar232);
                          if ((short)uVar30 == 0) goto LAB_01cf7144;
                          iVar1 = *(int *)(local_858.hit + 4);
                          iVar2 = *(int *)(local_858.hit + 8);
                          iVar74 = *(int *)(local_858.hit + 0xc);
                          iVar75 = *(int *)(local_858.hit + 0x10);
                          iVar76 = *(int *)(local_858.hit + 0x14);
                          iVar77 = *(int *)(local_858.hit + 0x18);
                          iVar78 = *(int *)(local_858.hit + 0x1c);
                          iVar79 = *(int *)(local_858.hit + 0x20);
                          iVar80 = *(int *)(local_858.hit + 0x24);
                          iVar81 = *(int *)(local_858.hit + 0x28);
                          iVar82 = *(int *)(local_858.hit + 0x2c);
                          iVar83 = *(int *)(local_858.hit + 0x30);
                          iVar84 = *(int *)(local_858.hit + 0x34);
                          iVar85 = *(int *)(local_858.hit + 0x38);
                          iVar86 = *(int *)(local_858.hit + 0x3c);
                          bVar98 = (byte)uVar30;
                          bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                          bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
                          bVar18 = (bool)((byte)(uVar30 >> 4) & 1);
                          bVar19 = (bool)((byte)(uVar30 >> 5) & 1);
                          bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
                          bVar21 = (bool)((byte)(uVar30 >> 7) & 1);
                          bVar88 = (byte)(uVar30 >> 8);
                          bVar22 = (bool)((byte)(uVar30 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar30 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar30 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar30 >> 0xe) & 1);
                          bVar28 = SUB81(uVar30 >> 0xf,0);
                          *(uint *)(local_858.ray + 0x300) =
                               (uint)(bVar98 & 1) * *(int *)local_858.hit |
                               (uint)!(bool)(bVar98 & 1) * *(int *)(local_858.ray + 0x300);
                          *(uint *)(local_858.ray + 0x304) =
                               (uint)bVar15 * iVar1 |
                               (uint)!bVar15 * *(int *)(local_858.ray + 0x304);
                          *(uint *)(local_858.ray + 0x308) =
                               (uint)bVar16 * iVar2 |
                               (uint)!bVar16 * *(int *)(local_858.ray + 0x308);
                          *(uint *)(local_858.ray + 0x30c) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_858.ray + 0x30c);
                          *(uint *)(local_858.ray + 0x310) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_858.ray + 0x310);
                          *(uint *)(local_858.ray + 0x314) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_858.ray + 0x314);
                          *(uint *)(local_858.ray + 0x318) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_858.ray + 0x318);
                          *(uint *)(local_858.ray + 0x31c) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_858.ray + 0x31c);
                          *(uint *)(local_858.ray + 800) =
                               (uint)(bVar88 & 1) * iVar79 |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_858.ray + 800);
                          *(uint *)(local_858.ray + 0x324) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_858.ray + 0x324);
                          *(uint *)(local_858.ray + 0x328) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_858.ray + 0x328);
                          *(uint *)(local_858.ray + 0x32c) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_858.ray + 0x32c);
                          *(uint *)(local_858.ray + 0x330) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_858.ray + 0x330);
                          *(uint *)(local_858.ray + 0x334) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_858.ray + 0x334);
                          *(uint *)(local_858.ray + 0x338) =
                               (uint)bVar27 * iVar85 |
                               (uint)!bVar27 * *(int *)(local_858.ray + 0x338);
                          *(uint *)(local_858.ray + 0x33c) =
                               (uint)bVar28 * iVar86 |
                               (uint)!bVar28 * *(int *)(local_858.ray + 0x33c);
                          iVar1 = *(int *)(local_858.hit + 0x44);
                          iVar2 = *(int *)(local_858.hit + 0x48);
                          iVar74 = *(int *)(local_858.hit + 0x4c);
                          iVar75 = *(int *)(local_858.hit + 0x50);
                          iVar76 = *(int *)(local_858.hit + 0x54);
                          iVar77 = *(int *)(local_858.hit + 0x58);
                          iVar78 = *(int *)(local_858.hit + 0x5c);
                          iVar79 = *(int *)(local_858.hit + 0x60);
                          iVar80 = *(int *)(local_858.hit + 100);
                          iVar81 = *(int *)(local_858.hit + 0x68);
                          iVar82 = *(int *)(local_858.hit + 0x6c);
                          iVar83 = *(int *)(local_858.hit + 0x70);
                          iVar84 = *(int *)(local_858.hit + 0x74);
                          iVar85 = *(int *)(local_858.hit + 0x78);
                          iVar86 = *(int *)(local_858.hit + 0x7c);
                          bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                          bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
                          bVar18 = (bool)((byte)(uVar30 >> 4) & 1);
                          bVar19 = (bool)((byte)(uVar30 >> 5) & 1);
                          bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
                          bVar21 = (bool)((byte)(uVar30 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar30 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar30 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar30 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar30 >> 0xe) & 1);
                          bVar28 = SUB81(uVar30 >> 0xf,0);
                          *(uint *)(local_858.ray + 0x340) =
                               (uint)(bVar98 & 1) * *(int *)(local_858.hit + 0x40) |
                               (uint)!(bool)(bVar98 & 1) * *(int *)(local_858.ray + 0x340);
                          *(uint *)(local_858.ray + 0x344) =
                               (uint)bVar15 * iVar1 |
                               (uint)!bVar15 * *(int *)(local_858.ray + 0x344);
                          *(uint *)(local_858.ray + 0x348) =
                               (uint)bVar16 * iVar2 |
                               (uint)!bVar16 * *(int *)(local_858.ray + 0x348);
                          *(uint *)(local_858.ray + 0x34c) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_858.ray + 0x34c);
                          *(uint *)(local_858.ray + 0x350) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_858.ray + 0x350);
                          *(uint *)(local_858.ray + 0x354) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_858.ray + 0x354);
                          *(uint *)(local_858.ray + 0x358) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_858.ray + 0x358);
                          *(uint *)(local_858.ray + 0x35c) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_858.ray + 0x35c);
                          *(uint *)(local_858.ray + 0x360) =
                               (uint)(bVar88 & 1) * iVar79 |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_858.ray + 0x360);
                          *(uint *)(local_858.ray + 0x364) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_858.ray + 0x364);
                          *(uint *)(local_858.ray + 0x368) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_858.ray + 0x368);
                          *(uint *)(local_858.ray + 0x36c) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_858.ray + 0x36c);
                          *(uint *)(local_858.ray + 0x370) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_858.ray + 0x370);
                          *(uint *)(local_858.ray + 0x374) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_858.ray + 0x374);
                          *(uint *)(local_858.ray + 0x378) =
                               (uint)bVar27 * iVar85 |
                               (uint)!bVar27 * *(int *)(local_858.ray + 0x378);
                          *(uint *)(local_858.ray + 0x37c) =
                               (uint)bVar28 * iVar86 |
                               (uint)!bVar28 * *(int *)(local_858.ray + 0x37c);
                          iVar1 = *(int *)(local_858.hit + 0x84);
                          iVar2 = *(int *)(local_858.hit + 0x88);
                          iVar74 = *(int *)(local_858.hit + 0x8c);
                          iVar75 = *(int *)(local_858.hit + 0x90);
                          iVar76 = *(int *)(local_858.hit + 0x94);
                          iVar77 = *(int *)(local_858.hit + 0x98);
                          iVar78 = *(int *)(local_858.hit + 0x9c);
                          iVar79 = *(int *)(local_858.hit + 0xa0);
                          iVar80 = *(int *)(local_858.hit + 0xa4);
                          iVar81 = *(int *)(local_858.hit + 0xa8);
                          iVar82 = *(int *)(local_858.hit + 0xac);
                          iVar83 = *(int *)(local_858.hit + 0xb0);
                          iVar84 = *(int *)(local_858.hit + 0xb4);
                          iVar85 = *(int *)(local_858.hit + 0xb8);
                          iVar86 = *(int *)(local_858.hit + 0xbc);
                          bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                          bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
                          bVar18 = (bool)((byte)(uVar30 >> 4) & 1);
                          bVar19 = (bool)((byte)(uVar30 >> 5) & 1);
                          bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
                          bVar21 = (bool)((byte)(uVar30 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar30 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar30 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar30 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar30 >> 0xe) & 1);
                          bVar28 = SUB81(uVar30 >> 0xf,0);
                          *(uint *)(local_858.ray + 0x380) =
                               (uint)(bVar98 & 1) * *(int *)(local_858.hit + 0x80) |
                               (uint)!(bool)(bVar98 & 1) * *(int *)(local_858.ray + 0x380);
                          *(uint *)(local_858.ray + 900) =
                               (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_858.ray + 900);
                          *(uint *)(local_858.ray + 0x388) =
                               (uint)bVar16 * iVar2 |
                               (uint)!bVar16 * *(int *)(local_858.ray + 0x388);
                          *(uint *)(local_858.ray + 0x38c) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_858.ray + 0x38c);
                          *(uint *)(local_858.ray + 0x390) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_858.ray + 0x390);
                          *(uint *)(local_858.ray + 0x394) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_858.ray + 0x394);
                          *(uint *)(local_858.ray + 0x398) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_858.ray + 0x398);
                          *(uint *)(local_858.ray + 0x39c) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_858.ray + 0x39c);
                          *(uint *)(local_858.ray + 0x3a0) =
                               (uint)(bVar88 & 1) * iVar79 |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_858.ray + 0x3a0);
                          *(uint *)(local_858.ray + 0x3a4) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_858.ray + 0x3a4);
                          *(uint *)(local_858.ray + 0x3a8) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_858.ray + 0x3a8);
                          *(uint *)(local_858.ray + 0x3ac) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_858.ray + 0x3ac);
                          *(uint *)(local_858.ray + 0x3b0) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_858.ray + 0x3b0);
                          *(uint *)(local_858.ray + 0x3b4) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_858.ray + 0x3b4);
                          *(uint *)(local_858.ray + 0x3b8) =
                               (uint)bVar27 * iVar85 |
                               (uint)!bVar27 * *(int *)(local_858.ray + 0x3b8);
                          *(uint *)(local_858.ray + 0x3bc) =
                               (uint)bVar28 * iVar86 |
                               (uint)!bVar28 * *(int *)(local_858.ray + 0x3bc);
                          iVar1 = *(int *)(local_858.hit + 0xc4);
                          iVar2 = *(int *)(local_858.hit + 200);
                          iVar74 = *(int *)(local_858.hit + 0xcc);
                          iVar75 = *(int *)(local_858.hit + 0xd0);
                          iVar76 = *(int *)(local_858.hit + 0xd4);
                          iVar77 = *(int *)(local_858.hit + 0xd8);
                          iVar78 = *(int *)(local_858.hit + 0xdc);
                          iVar79 = *(int *)(local_858.hit + 0xe0);
                          iVar80 = *(int *)(local_858.hit + 0xe4);
                          iVar81 = *(int *)(local_858.hit + 0xe8);
                          iVar82 = *(int *)(local_858.hit + 0xec);
                          iVar83 = *(int *)(local_858.hit + 0xf0);
                          iVar84 = *(int *)(local_858.hit + 0xf4);
                          iVar85 = *(int *)(local_858.hit + 0xf8);
                          iVar86 = *(int *)(local_858.hit + 0xfc);
                          bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                          bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
                          bVar18 = (bool)((byte)(uVar30 >> 4) & 1);
                          bVar19 = (bool)((byte)(uVar30 >> 5) & 1);
                          bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
                          bVar21 = (bool)((byte)(uVar30 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar30 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar30 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar30 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar30 >> 0xe) & 1);
                          bVar28 = SUB81(uVar30 >> 0xf,0);
                          *(uint *)(local_858.ray + 0x3c0) =
                               (uint)(bVar98 & 1) * *(int *)(local_858.hit + 0xc0) |
                               (uint)!(bool)(bVar98 & 1) * *(int *)(local_858.ray + 0x3c0);
                          *(uint *)(local_858.ray + 0x3c4) =
                               (uint)bVar15 * iVar1 |
                               (uint)!bVar15 * *(int *)(local_858.ray + 0x3c4);
                          *(uint *)(local_858.ray + 0x3c8) =
                               (uint)bVar16 * iVar2 |
                               (uint)!bVar16 * *(int *)(local_858.ray + 0x3c8);
                          *(uint *)(local_858.ray + 0x3cc) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_858.ray + 0x3cc);
                          *(uint *)(local_858.ray + 0x3d0) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_858.ray + 0x3d0);
                          *(uint *)(local_858.ray + 0x3d4) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_858.ray + 0x3d4);
                          *(uint *)(local_858.ray + 0x3d8) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_858.ray + 0x3d8);
                          *(uint *)(local_858.ray + 0x3dc) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_858.ray + 0x3dc);
                          *(uint *)(local_858.ray + 0x3e0) =
                               (uint)(bVar88 & 1) * iVar79 |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_858.ray + 0x3e0);
                          *(uint *)(local_858.ray + 0x3e4) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_858.ray + 0x3e4);
                          *(uint *)(local_858.ray + 1000) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_858.ray + 1000);
                          *(uint *)(local_858.ray + 0x3ec) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_858.ray + 0x3ec);
                          *(uint *)(local_858.ray + 0x3f0) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_858.ray + 0x3f0);
                          *(uint *)(local_858.ray + 0x3f4) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_858.ray + 0x3f4);
                          *(uint *)(local_858.ray + 0x3f8) =
                               (uint)bVar27 * iVar85 |
                               (uint)!bVar27 * *(int *)(local_858.ray + 0x3f8);
                          *(uint *)(local_858.ray + 0x3fc) =
                               (uint)bVar28 * iVar86 |
                               (uint)!bVar28 * *(int *)(local_858.ray + 0x3fc);
                          iVar1 = *(int *)(local_858.hit + 0x104);
                          iVar2 = *(int *)(local_858.hit + 0x108);
                          iVar74 = *(int *)(local_858.hit + 0x10c);
                          iVar75 = *(int *)(local_858.hit + 0x110);
                          iVar76 = *(int *)(local_858.hit + 0x114);
                          iVar77 = *(int *)(local_858.hit + 0x118);
                          iVar78 = *(int *)(local_858.hit + 0x11c);
                          iVar79 = *(int *)(local_858.hit + 0x120);
                          iVar80 = *(int *)(local_858.hit + 0x124);
                          iVar81 = *(int *)(local_858.hit + 0x128);
                          iVar82 = *(int *)(local_858.hit + 300);
                          iVar83 = *(int *)(local_858.hit + 0x130);
                          iVar84 = *(int *)(local_858.hit + 0x134);
                          iVar85 = *(int *)(local_858.hit + 0x138);
                          iVar86 = *(int *)(local_858.hit + 0x13c);
                          bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                          bVar17 = (bool)((byte)(uVar30 >> 3) & 1);
                          bVar18 = (bool)((byte)(uVar30 >> 4) & 1);
                          bVar19 = (bool)((byte)(uVar30 >> 5) & 1);
                          bVar20 = (bool)((byte)(uVar30 >> 6) & 1);
                          bVar21 = (bool)((byte)(uVar30 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar30 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar30 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar30 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar30 >> 0xe) & 1);
                          bVar28 = SUB81(uVar30 >> 0xf,0);
                          *(uint *)(local_858.ray + 0x400) =
                               (uint)(bVar98 & 1) * *(int *)(local_858.hit + 0x100) |
                               (uint)!(bool)(bVar98 & 1) * *(int *)(local_858.ray + 0x400);
                          *(uint *)(local_858.ray + 0x404) =
                               (uint)bVar15 * iVar1 |
                               (uint)!bVar15 * *(int *)(local_858.ray + 0x404);
                          *(uint *)(local_858.ray + 0x408) =
                               (uint)bVar16 * iVar2 |
                               (uint)!bVar16 * *(int *)(local_858.ray + 0x408);
                          *(uint *)(local_858.ray + 0x40c) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_858.ray + 0x40c);
                          *(uint *)(local_858.ray + 0x410) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_858.ray + 0x410);
                          *(uint *)(local_858.ray + 0x414) =
                               (uint)bVar19 * iVar76 |
                               (uint)!bVar19 * *(int *)(local_858.ray + 0x414);
                          *(uint *)(local_858.ray + 0x418) =
                               (uint)bVar20 * iVar77 |
                               (uint)!bVar20 * *(int *)(local_858.ray + 0x418);
                          *(uint *)(local_858.ray + 0x41c) =
                               (uint)bVar21 * iVar78 |
                               (uint)!bVar21 * *(int *)(local_858.ray + 0x41c);
                          *(uint *)(local_858.ray + 0x420) =
                               (uint)(bVar88 & 1) * iVar79 |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_858.ray + 0x420);
                          *(uint *)(local_858.ray + 0x424) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_858.ray + 0x424);
                          *(uint *)(local_858.ray + 0x428) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_858.ray + 0x428);
                          *(uint *)(local_858.ray + 0x42c) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_858.ray + 0x42c);
                          *(uint *)(local_858.ray + 0x430) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_858.ray + 0x430);
                          *(uint *)(local_858.ray + 0x434) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_858.ray + 0x434);
                          *(uint *)(local_858.ray + 0x438) =
                               (uint)bVar27 * iVar85 |
                               (uint)!bVar27 * *(int *)(local_858.ray + 0x438);
                          *(uint *)(local_858.ray + 0x43c) =
                               (uint)bVar28 * iVar86 |
                               (uint)!bVar28 * *(int *)(local_858.ray + 0x43c);
                          auVar232 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x140)
                                                      );
                          auVar232 = vmovdqu32_avx512f(auVar232);
                          *(undefined1 (*) [64])(local_858.ray + 0x440) = auVar232;
                          auVar232 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x180)
                                                      );
                          auVar232 = vmovdqu32_avx512f(auVar232);
                          *(undefined1 (*) [64])(local_858.ray + 0x480) = auVar232;
                          auVar232 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x1c0)
                                                      );
                          auVar232 = vmovdqa32_avx512f(auVar232);
                          *(undefined1 (*) [64])(local_858.ray + 0x4c0) = auVar232;
                          auVar232 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_858.hit + 0x200)
                                                      );
                          auVar232 = vmovdqa32_avx512f(auVar232);
                          *(undefined1 (*) [64])(local_858.ray + 0x500) = auVar232;
                          auVar231 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                        }
                        bVar98 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & (byte)uVar99;
                        uVar155 = auVar231._0_4_;
                        auVar166._4_4_ = uVar155;
                        auVar166._0_4_ = uVar155;
                        auVar166._8_4_ = uVar155;
                        auVar166._12_4_ = uVar155;
                        auVar166._16_4_ = uVar155;
                        auVar166._20_4_ = uVar155;
                        auVar166._24_4_ = uVar155;
                        auVar166._28_4_ = uVar155;
                        uVar29 = vcmpps_avx512vl(auVar217._0_32_,auVar166,2);
                        if ((bVar98 & (byte)uVar29) == 0) goto LAB_01cf71d8;
                        bVar98 = bVar98 & (byte)uVar29;
                        uVar99 = (ulong)bVar98;
                        auVar167._8_4_ = 0x7f800000;
                        auVar167._0_8_ = 0x7f8000007f800000;
                        auVar167._12_4_ = 0x7f800000;
                        auVar167._16_4_ = 0x7f800000;
                        auVar167._20_4_ = 0x7f800000;
                        auVar167._24_4_ = 0x7f800000;
                        auVar167._28_4_ = 0x7f800000;
                        auVar114 = vblendmps_avx512vl(auVar167,auVar217._0_32_);
                        auVar146._0_4_ =
                             (uint)(bVar98 & 1) * auVar114._0_4_ |
                             (uint)!(bool)(bVar98 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar98 >> 1 & 1);
                        auVar146._4_4_ = (uint)bVar15 * auVar114._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar98 >> 2 & 1);
                        auVar146._8_4_ = (uint)bVar15 * auVar114._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar98 >> 3 & 1);
                        auVar146._12_4_ =
                             (uint)bVar15 * auVar114._12_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar98 >> 4 & 1);
                        auVar146._16_4_ =
                             (uint)bVar15 * auVar114._16_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar98 >> 5 & 1);
                        auVar146._20_4_ =
                             (uint)bVar15 * auVar114._20_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar98 >> 6 & 1);
                        auVar146._24_4_ =
                             (uint)bVar15 * auVar114._24_4_ | (uint)!bVar15 * 0x7f800000;
                        auVar146._28_4_ =
                             (uint)(bVar98 >> 7) * auVar114._28_4_ |
                             (uint)!(bool)(bVar98 >> 7) * 0x7f800000;
                        auVar114 = vshufps_avx(auVar146,auVar146,0xb1);
                        auVar114 = vminps_avx(auVar146,auVar114);
                        auVar112 = vshufpd_avx(auVar114,auVar114,5);
                        auVar114 = vminps_avx(auVar114,auVar112);
                        auVar112 = vpermpd_avx2(auVar114,0x4e);
                        auVar114 = vminps_avx(auVar114,auVar112);
                        uVar29 = vcmpps_avx512vl(auVar146,auVar114,0);
                        bVar88 = (byte)uVar29 & bVar98;
                        if (bVar88 != 0) {
                          bVar98 = bVar88;
                        }
                        uVar91 = 0;
                        for (uVar92 = (uint)bVar98; (uVar92 & 1) == 0;
                            uVar92 = uVar92 >> 1 | 0x80000000) {
                          uVar91 = uVar91 + 1;
                        }
                        uVar89 = (ulong)uVar91;
                      } while( true );
                    }
                    fVar180 = local_580[uVar89];
                    uVar155 = *(undefined4 *)(local_560 + uVar89 * 4);
                    fVar175 = 1.0 - fVar180;
                    fVar174 = fVar175 * fVar175 * -3.0;
                    auVar208 = ZEXT464((uint)fVar174);
                    auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar175 * fVar175)),
                                               ZEXT416((uint)(fVar180 * fVar175)),
                                               ZEXT416(0xc0000000));
                    auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar180 * fVar175)),
                                               ZEXT416((uint)(fVar180 * fVar180)),
                                               ZEXT416(0x40000000));
                    fVar175 = auVar106._0_4_ * 3.0;
                    fVar176 = auVar104._0_4_ * 3.0;
                    fVar191 = fVar180 * fVar180 * 3.0;
                    auVar210._0_4_ = fVar191 * fVar154;
                    auVar210._4_4_ = fVar191 * fVar171;
                    auVar210._8_4_ = fVar191 * fVar172;
                    auVar210._12_4_ = fVar191 * fVar173;
                    auVar213 = ZEXT1664(auVar210);
                    auVar186._4_4_ = fVar176;
                    auVar186._0_4_ = fVar176;
                    auVar186._8_4_ = fVar176;
                    auVar186._12_4_ = fVar176;
                    auVar106 = vfmadd132ps_fma(auVar186,auVar210,auVar6);
                    auVar193._4_4_ = fVar175;
                    auVar193._0_4_ = fVar175;
                    auVar193._8_4_ = fVar175;
                    auVar193._12_4_ = fVar175;
                    auVar106 = vfmadd132ps_fma(auVar193,auVar106,auVar32);
                    auVar187._4_4_ = fVar174;
                    auVar187._0_4_ = fVar174;
                    auVar187._8_4_ = fVar174;
                    auVar187._12_4_ = fVar174;
                    auVar106 = vfmadd132ps_fma(auVar187,auVar106,auVar102);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar89 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar106._0_4_;
                    uVar13 = vextractps_avx(auVar106,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar13;
                    uVar13 = vextractps_avx(auVar106,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar13;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar180;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar155;
                    *(uint *)(ray + k * 4 + 0x440) = uVar11;
                    *(uint *)(ray + k * 4 + 0x480) = uVar97;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01cf6e09;
      }
LAB_01cf64ad:
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar36._4_4_ = uVar155;
      auVar36._0_4_ = uVar155;
      auVar36._8_4_ = uVar155;
      auVar36._12_4_ = uVar155;
      auVar36._16_4_ = uVar155;
      auVar36._20_4_ = uVar155;
      auVar36._24_4_ = uVar155;
      auVar36._28_4_ = uVar155;
      uVar29 = vcmpps_avx512vl(local_320,auVar36,2);
      uVar97 = (uint)uVar94 & (uint)uVar94 + 0xff & (uint)uVar29;
      uVar94 = (ulong)uVar97;
    } while (uVar97 != 0);
  }
  return;
LAB_01cf71d8:
  auVar114 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar232 = ZEXT3264(auVar114);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar170 = ZEXT1664(auVar106);
  auVar233 = ZEXT3264(local_7e0);
  auVar114 = vmovdqa64_avx512vl(local_3e0);
  auVar234 = ZEXT3264(auVar114);
LAB_01cf6e09:
  lVar95 = lVar95 + 8;
  if (iVar12 <= (int)lVar95) goto LAB_01cf64ad;
  goto LAB_01cf6559;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }